

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  uint uVar65;
  uint uVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  ulong uVar70;
  long lVar72;
  byte bVar73;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  long lVar77;
  bool bVar78;
  float fVar79;
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined4 uVar80;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  vint4 bi_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar138;
  float fVar139;
  vint4 bi;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar140;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar181;
  float fVar182;
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar183;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar184;
  float fVar199;
  vint4 ai_1;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar200;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  float fVar201;
  undefined8 uVar202;
  float fVar225;
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar217 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar224;
  float fVar226;
  undefined1 auVar223 [32];
  float fVar230;
  float fVar247;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar255 [16];
  undefined1 auVar268 [32];
  float fVar269;
  float fVar279;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  float fVar280;
  float fVar290;
  float fVar291;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar292;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar324 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar333;
  float fVar343;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_669;
  undefined1 local_668 [16];
  undefined1 local_658 [8];
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_448;
  Primitive *local_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  uint auStack_3b8 [4];
  RTCFilterFunctionNArguments local_3a8;
  undefined1 local_378 [32];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [32];
  uint uStack_248;
  float afStack_244 [7];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar71;
  undefined1 auVar156 [32];
  
  PVar6 = prim[1];
  uVar70 = (ulong)(byte)PVar6;
  lVar72 = uVar70 * 0x25;
  fVar79 = *(float *)(prim + lVar72 + 0x12);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar81._0_4_ = fVar79 * auVar14._0_4_;
  auVar81._4_4_ = fVar79 * auVar14._4_4_;
  auVar81._8_4_ = fVar79 * auVar14._8_4_;
  auVar81._12_4_ = fVar79 * auVar14._12_4_;
  auVar104._0_4_ = fVar79 * auVar15._0_4_;
  auVar104._4_4_ = fVar79 * auVar15._4_4_;
  auVar104._8_4_ = fVar79 * auVar15._8_4_;
  auVar104._12_4_ = fVar79 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar70 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar334._4_4_ = auVar104._0_4_;
  auVar334._0_4_ = auVar104._0_4_;
  auVar334._8_4_ = auVar104._0_4_;
  auVar334._12_4_ = auVar104._0_4_;
  auVar22 = vshufps_avx(auVar104,auVar104,0x55);
  auVar319 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar79 = auVar319._0_4_;
  auVar281._0_4_ = fVar79 * auVar16._0_4_;
  fVar184 = auVar319._4_4_;
  auVar281._4_4_ = fVar184 * auVar16._4_4_;
  fVar199 = auVar319._8_4_;
  auVar281._8_4_ = fVar199 * auVar16._8_4_;
  fVar142 = auVar319._12_4_;
  auVar281._12_4_ = fVar142 * auVar16._12_4_;
  auVar270._0_4_ = auVar164._0_4_ * fVar79;
  auVar270._4_4_ = auVar164._4_4_ * fVar184;
  auVar270._8_4_ = auVar164._8_4_ * fVar199;
  auVar270._12_4_ = auVar164._12_4_ * fVar142;
  auVar248._0_4_ = auVar21._0_4_ * fVar79;
  auVar248._4_4_ = auVar21._4_4_ * fVar184;
  auVar248._8_4_ = auVar21._8_4_ * fVar199;
  auVar248._12_4_ = auVar21._12_4_ * fVar142;
  auVar319 = vfmadd231ps_fma(auVar281,auVar22,auVar15);
  auVar31 = vfmadd231ps_fma(auVar270,auVar22,auVar18);
  auVar22 = vfmadd231ps_fma(auVar248,auVar20,auVar22);
  auVar93 = vfmadd231ps_fma(auVar319,auVar334,auVar14);
  auVar31 = vfmadd231ps_fma(auVar31,auVar334,auVar17);
  auVar83 = vfmadd231ps_fma(auVar22,auVar19,auVar334);
  auVar335._4_4_ = auVar81._0_4_;
  auVar335._0_4_ = auVar81._0_4_;
  auVar335._8_4_ = auVar81._0_4_;
  auVar335._12_4_ = auVar81._0_4_;
  auVar22 = vshufps_avx(auVar81,auVar81,0x55);
  auVar319 = vshufps_avx(auVar81,auVar81,0xaa);
  fVar79 = auVar319._0_4_;
  auVar258._0_4_ = fVar79 * auVar16._0_4_;
  fVar184 = auVar319._4_4_;
  auVar258._4_4_ = fVar184 * auVar16._4_4_;
  fVar199 = auVar319._8_4_;
  auVar258._8_4_ = fVar199 * auVar16._8_4_;
  fVar142 = auVar319._12_4_;
  auVar258._12_4_ = fVar142 * auVar16._12_4_;
  auVar96._0_4_ = auVar164._0_4_ * fVar79;
  auVar96._4_4_ = auVar164._4_4_ * fVar184;
  auVar96._8_4_ = auVar164._8_4_ * fVar199;
  auVar96._12_4_ = auVar164._12_4_ * fVar142;
  auVar82._0_4_ = auVar21._0_4_ * fVar79;
  auVar82._4_4_ = auVar21._4_4_ * fVar184;
  auVar82._8_4_ = auVar21._8_4_ * fVar199;
  auVar82._12_4_ = auVar21._12_4_ * fVar142;
  auVar15 = vfmadd231ps_fma(auVar258,auVar22,auVar15);
  auVar16 = vfmadd231ps_fma(auVar96,auVar22,auVar18);
  auVar18 = vfmadd231ps_fma(auVar82,auVar22,auVar20);
  auVar96 = vfmadd231ps_fma(auVar15,auVar335,auVar14);
  auVar97 = vfmadd231ps_fma(auVar16,auVar335,auVar17);
  auVar98 = vfmadd231ps_fma(auVar18,auVar335,auVar19);
  auVar336._8_4_ = 0x7fffffff;
  auVar336._0_8_ = 0x7fffffff7fffffff;
  auVar336._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar93,auVar336);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar203,1);
  auVar15 = vblendvps_avx(auVar93,auVar203,auVar14);
  auVar14 = vandps_avx(auVar31,auVar336);
  auVar14 = vcmpps_avx(auVar14,auVar203,1);
  auVar16 = vblendvps_avx(auVar31,auVar203,auVar14);
  auVar14 = vandps_avx(auVar83,auVar336);
  auVar14 = vcmpps_avx(auVar14,auVar203,1);
  auVar14 = vblendvps_avx(auVar83,auVar203,auVar14);
  auVar17 = vrcpps_avx(auVar15);
  auVar231._8_4_ = 0x3f800000;
  auVar231._0_8_ = &DAT_3f8000003f800000;
  auVar231._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar231);
  auVar93 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar231);
  auVar83 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar231);
  auVar81 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  fVar79 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar72 + 0x16)) *
           *(float *)(prim + lVar72 + 0x1a);
  auVar204._4_4_ = fVar79;
  auVar204._0_4_ = fVar79;
  auVar204._8_4_ = fVar79;
  auVar204._12_4_ = fVar79;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vsubps_avx(auVar15,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar82 = vfmadd213ps_fma(auVar17,auVar204,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar16);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar17 = vfmadd213ps_fma(auVar15,auVar204,auVar14);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar76 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar76 + 6);
  auVar15 = vpmovsxwd_avx(auVar164);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vsubps_avx(auVar15,auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar16 = vfmadd213ps_fma(auVar16,auVar204,auVar14);
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar18 = vfmadd213ps_fma(auVar15,auVar204,auVar14);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar14 = vpmovsxwd_avx(auVar21);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar22);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar164 = vfmadd213ps_fma(auVar15,auVar204,auVar14);
  auVar319._8_8_ = 0;
  auVar319._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar70) + 6);
  auVar14 = vpmovsxwd_avx(auVar319);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar31);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar15 = vfmadd213ps_fma(auVar15,auVar204,auVar14);
  auVar14 = vsubps_avx(auVar82,auVar96);
  auVar205._0_4_ = auVar93._0_4_ * auVar14._0_4_;
  auVar205._4_4_ = auVar93._4_4_ * auVar14._4_4_;
  auVar205._8_4_ = auVar93._8_4_ * auVar14._8_4_;
  auVar205._12_4_ = auVar93._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar17,auVar96);
  auVar120._0_4_ = auVar93._0_4_ * auVar14._0_4_;
  auVar120._4_4_ = auVar93._4_4_ * auVar14._4_4_;
  auVar120._8_4_ = auVar93._8_4_ * auVar14._8_4_;
  auVar120._12_4_ = auVar93._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar16,auVar97);
  auVar171._0_4_ = auVar83._0_4_ * auVar14._0_4_;
  auVar171._4_4_ = auVar83._4_4_ * auVar14._4_4_;
  auVar171._8_4_ = auVar83._8_4_ * auVar14._8_4_;
  auVar171._12_4_ = auVar83._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar18,auVar97);
  auVar97._0_4_ = auVar83._0_4_ * auVar14._0_4_;
  auVar97._4_4_ = auVar83._4_4_ * auVar14._4_4_;
  auVar97._8_4_ = auVar83._8_4_ * auVar14._8_4_;
  auVar97._12_4_ = auVar83._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar164,auVar98);
  auVar160._0_4_ = auVar81._0_4_ * auVar14._0_4_;
  auVar160._4_4_ = auVar81._4_4_ * auVar14._4_4_;
  auVar160._8_4_ = auVar81._8_4_ * auVar14._8_4_;
  auVar160._12_4_ = auVar81._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar15,auVar98);
  auVar93._0_4_ = auVar81._0_4_ * auVar14._0_4_;
  auVar93._4_4_ = auVar81._4_4_ * auVar14._4_4_;
  auVar93._8_4_ = auVar81._8_4_ * auVar14._8_4_;
  auVar93._12_4_ = auVar81._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar205,auVar120);
  auVar15 = vpminsd_avx(auVar171,auVar97);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar160,auVar93);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar249._4_4_ = uVar80;
  auVar249._0_4_ = uVar80;
  auVar249._8_4_ = uVar80;
  auVar249._12_4_ = uVar80;
  auVar15 = vmaxps_avx(auVar15,auVar249);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_2f8._0_4_ = auVar14._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar14._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar14._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar205,auVar120);
  auVar15 = vpmaxsd_avx(auVar171,auVar97);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar160,auVar93);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar80;
  auVar121._0_4_ = uVar80;
  auVar121._8_4_ = uVar80;
  auVar121._12_4_ = uVar80;
  auVar15 = vminps_avx(auVar15,auVar121);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar83._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar98._1_3_ = 0;
  auVar98[0] = PVar6;
  auVar98[4] = PVar6;
  auVar98._5_3_ = 0;
  auVar98[8] = PVar6;
  auVar98._9_3_ = 0;
  auVar98[0xc] = PVar6;
  auVar98._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar98,_DAT_01ff0cf0);
  auVar14 = vcmpps_avx(local_2f8,auVar83,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar65 = vmovmskps_avx(auVar14);
  local_669 = uVar65 != 0;
  if (uVar65 == 0) {
    return local_669;
  }
  uVar65 = uVar65 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_268 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_440 = prim;
LAB_0178f00a:
  lVar72 = 0;
  for (uVar70 = (ulong)uVar65; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar69 = *(uint *)(local_440 + 2);
  local_318 = *(uint *)(local_440 + lVar72 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar69].ptr;
  fVar79 = (pGVar7->time_range).lower;
  fVar199 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar79) / ((pGVar7->time_range).upper - fVar79));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar22 = vmaxss_avx(ZEXT816(0),auVar14);
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)local_318 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar77 = (long)(int)auVar22._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar77);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar77);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar70);
  lVar72 = uVar70 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar72);
  lVar1 = uVar70 + 2;
  auVar16 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar70 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar9 + lVar10 * lVar2);
  auVar63 = *pauVar3;
  fVar79 = *(float *)pauVar3[1];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar77);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar77);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar70);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar72);
  auVar164 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar184 = *pfVar4;
  fVar142 = pfVar4[1];
  fVar200 = pfVar4[2];
  fVar141 = pfVar4[3];
  auVar319 = ZEXT816(0) << 0x40;
  auVar296._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar296._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar296._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar296._12_4_ = fVar79 * 0.0;
  auVar143._8_4_ = 0x3e2aaaab;
  auVar143._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar143._12_4_ = 0x3e2aaaab;
  auVar93 = vfmadd213ps_fma(auVar143,auVar16,auVar296);
  auVar161._8_4_ = 0x3f000000;
  auVar161._0_8_ = 0x3f0000003f000000;
  auVar161._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar296,auVar16,auVar161);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar15,auVar319);
  auVar120 = vfnmadd231ps_fma(auVar19,auVar14,auVar161);
  auVar185._0_4_ = fVar184 * 0.0;
  auVar185._4_4_ = fVar142 * 0.0;
  auVar185._8_4_ = fVar200 * 0.0;
  auVar185._12_4_ = fVar141 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar143,auVar164,auVar185);
  auVar144._8_4_ = 0x3f2aaaab;
  auVar144._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar144._12_4_ = 0x3f2aaaab;
  auVar19 = vfmadd231ps_fma(auVar19,auVar18,auVar144);
  auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar143);
  auVar20 = vfmadd231ps_fma(auVar185,auVar164,auVar161);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar18,auVar319);
  auVar21 = vfnmadd231ps_fma(auVar20,auVar17,auVar161);
  auVar308._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar308._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar308._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar308._12_4_ = fVar79 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar308,auVar319,auVar16);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar161,auVar15);
  auVar121 = vfnmadd231ps_fma(auVar20,auVar319,auVar14);
  auVar250._0_4_ = fVar184 * 0.16666667;
  auVar250._4_4_ = fVar142 * 0.16666667;
  auVar250._8_4_ = fVar200 * 0.16666667;
  auVar250._12_4_ = fVar141 * 0.16666667;
  auVar20 = vfmadd231ps_fma(auVar250,auVar164,auVar144);
  auVar20 = vfmadd231ps_fma(auVar20,auVar18,auVar143);
  auVar20 = vfmadd231ps_fma(auVar20,auVar17,auVar319);
  auVar206._0_4_ = fVar184 * 0.5;
  auVar206._4_4_ = fVar142 * 0.5;
  auVar206._8_4_ = fVar200 * 0.5;
  auVar206._12_4_ = fVar141 * 0.5;
  auVar164 = vfmadd231ps_fma(auVar206,auVar319,auVar164);
  auVar18 = vfnmadd231ps_fma(auVar164,auVar161,auVar18);
  auVar164 = vfnmadd231ps_fma(auVar18,auVar319,auVar17);
  auVar17 = vshufps_avx(auVar120,auVar120,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar293 = auVar120._0_4_;
  auVar99._0_4_ = fVar293 * auVar18._0_4_;
  fVar227 = auVar120._4_4_;
  auVar99._4_4_ = fVar227 * auVar18._4_4_;
  fVar294 = auVar120._8_4_;
  auVar99._8_4_ = fVar294 * auVar18._8_4_;
  fVar228 = auVar120._12_4_;
  auVar99._12_4_ = fVar228 * auVar18._12_4_;
  auVar81 = vfmsub231ps_fma(auVar99,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar100._0_4_ = fVar293 * auVar18._0_4_;
  auVar100._4_4_ = fVar227 * auVar18._4_4_;
  auVar100._8_4_ = fVar294 * auVar18._8_4_;
  auVar100._12_4_ = fVar228 * auVar18._12_4_;
  auVar82 = vfmsub231ps_fma(auVar100,auVar17,auVar21);
  auVar17 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar295 = auVar121._0_4_;
  auVar101._0_4_ = fVar295 * auVar18._0_4_;
  fVar229 = auVar121._4_4_;
  auVar101._4_4_ = fVar229 * auVar18._4_4_;
  fVar230 = auVar121._8_4_;
  auVar101._8_4_ = fVar230 * auVar18._8_4_;
  fVar247 = auVar121._12_4_;
  auVar101._12_4_ = fVar247 * auVar18._12_4_;
  auVar96 = vfmsub231ps_fma(auVar101,auVar17,auVar20);
  auVar18 = vshufps_avx(auVar164,auVar164,0xc9);
  auVar102._0_4_ = fVar295 * auVar18._0_4_;
  auVar102._4_4_ = fVar229 * auVar18._4_4_;
  auVar102._8_4_ = fVar230 * auVar18._8_4_;
  auVar102._12_4_ = fVar247 * auVar18._12_4_;
  auVar97 = vfmsub231ps_fma(auVar102,auVar17,auVar164);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar77);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar77);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar64 = *pauVar3;
  fVar141 = *(float *)pauVar3[1];
  lVar12 = *(long *)(lVar9 + 0x38 + lVar77);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar77);
  auVar271._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar271._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar271._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar271._12_4_ = fVar141 * 0.0;
  auVar83 = vfmadd213ps_fma(auVar143,auVar17,auVar271);
  auVar164 = vfmadd231ps_fma(auVar271,auVar17,auVar161);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar72);
  auVar19 = vfnmadd231ps_fma(auVar164,auVar18,ZEXT816(0) << 0x20);
  auVar164 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar70);
  auVar160 = vfnmadd231ps_fma(auVar19,auVar164,auVar161);
  auVar19 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  pfVar4 = (float *)(lVar12 + lVar9 * lVar2);
  fVar184 = *pfVar4;
  fVar142 = pfVar4[1];
  fVar200 = pfVar4[2];
  fVar119 = pfVar4[3];
  auVar84._0_4_ = fVar184 * 0.0;
  auVar84._4_4_ = fVar142 * 0.0;
  auVar84._8_4_ = fVar200 * 0.0;
  auVar84._12_4_ = fVar119 * 0.0;
  auVar21 = vfmadd213ps_fma(auVar143,auVar19,auVar84);
  auVar20 = *(undefined1 (*) [16])(lVar12 + lVar72 * lVar9);
  auVar103._8_4_ = 0x3f2aaaab;
  auVar103._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar103._12_4_ = 0x3f2aaaab;
  auVar319 = vfmadd231ps_fma(auVar21,auVar20,auVar103);
  auVar21 = *(undefined1 (*) [16])(lVar12 + uVar70 * lVar9);
  auVar31 = vfmadd231ps_fma(auVar319,auVar21,auVar143);
  auVar319 = vshufps_avx(auVar31,auVar31,0xc9);
  fVar291 = auVar160._0_4_;
  auVar186._0_4_ = fVar291 * auVar319._0_4_;
  fVar225 = auVar160._4_4_;
  auVar186._4_4_ = fVar225 * auVar319._4_4_;
  fVar292 = auVar160._8_4_;
  auVar186._8_4_ = fVar292 * auVar319._8_4_;
  fVar226 = auVar160._12_4_;
  auVar186._12_4_ = fVar226 * auVar319._12_4_;
  auVar319 = vshufps_avx(auVar160,auVar160,0xc9);
  auVar98 = vfmsub231ps_fma(auVar186,auVar319,auVar31);
  auVar187._8_4_ = 0x3f000000;
  auVar187._0_8_ = 0x3f0000003f000000;
  auVar187._12_4_ = 0x3f000000;
  auVar31 = vfmadd231ps_fma(auVar84,auVar19,auVar187);
  auVar31 = vfnmadd231ps_fma(auVar31,auVar20,_DAT_01feba10);
  auVar104 = vfnmadd231ps_fma(auVar31,auVar21,auVar187);
  auVar31 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar232._0_4_ = fVar291 * auVar31._0_4_;
  auVar232._4_4_ = fVar225 * auVar31._4_4_;
  auVar232._8_4_ = fVar292 * auVar31._8_4_;
  auVar232._12_4_ = fVar226 * auVar31._12_4_;
  auVar31 = vfmsub231ps_fma(auVar232,auVar319,auVar104);
  auVar85._0_4_ = fVar184 * 0.16666667;
  auVar85._4_4_ = fVar142 * 0.16666667;
  auVar85._8_4_ = fVar200 * 0.16666667;
  auVar85._12_4_ = fVar119 * 0.16666667;
  auVar233._8_4_ = 0x3f2aaaab;
  auVar233._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar233._12_4_ = 0x3f2aaaab;
  auVar319 = vfmadd231ps_fma(auVar85,auVar19,auVar233);
  auVar145._0_4_ = fVar184 * 0.5;
  auVar145._4_4_ = fVar142 * 0.5;
  auVar145._8_4_ = fVar200 * 0.5;
  auVar145._12_4_ = fVar119 * 0.5;
  auVar104 = ZEXT816(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar145,auVar104,auVar19);
  auVar319 = vfmadd231ps_fma(auVar319,auVar20,auVar143);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar187,auVar20);
  auVar20 = vfmadd231ps_fma(auVar319,auVar21,auVar104);
  auVar21 = vfnmadd231ps_fma(auVar19,auVar104,auVar21);
  auVar207._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar207._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar207._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar207._12_4_ = fVar141 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar207,auVar104,auVar17);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar187,auVar18);
  auVar171 = vfnmadd231ps_fma(auVar19,auVar104,auVar164);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar280 = auVar171._0_4_;
  auVar105._0_4_ = fVar280 * auVar19._0_4_;
  fVar201 = auVar171._4_4_;
  auVar105._4_4_ = fVar201 * auVar19._4_4_;
  fVar290 = auVar171._8_4_;
  auVar105._8_4_ = fVar290 * auVar19._8_4_;
  fVar224 = auVar171._12_4_;
  auVar105._12_4_ = fVar224 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar171,auVar171,0xc9);
  auVar104 = vfmsub231ps_fma(auVar105,auVar19,auVar20);
  auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar86._0_4_ = fVar280 * auVar20._0_4_;
  auVar86._4_4_ = fVar201 * auVar20._4_4_;
  auVar86._8_4_ = fVar290 * auVar20._8_4_;
  auVar86._12_4_ = fVar224 * auVar20._12_4_;
  auVar258 = vfmsub231ps_fma(auVar86,auVar19,auVar21);
  fVar199 = fVar199 - auVar22._0_4_;
  local_618._0_4_ = auVar63._0_4_;
  local_618._4_4_ = auVar63._4_4_;
  fStack_610 = auVar63._8_4_;
  auVar106._0_4_ = (float)local_618._0_4_ * 0.16666667;
  auVar106._4_4_ = (float)local_618._4_4_ * 0.16666667;
  auVar106._8_4_ = fStack_610 * 0.16666667;
  auVar106._12_4_ = fVar79 * 0.16666667;
  auVar16 = vfmadd231ps_fma(auVar106,auVar233,auVar16);
  auVar19 = vfmadd231ps_fma(auVar93,auVar15,auVar233);
  auVar15 = vfmadd231ps_fma(auVar16,auVar15,auVar143);
  auVar22 = vfmadd231ps_fma(auVar19,auVar14,auVar143);
  auVar87._0_12_ = ZEXT812(0);
  auVar87._12_4_ = 0;
  auVar319 = vfmadd231ps_fma(auVar15,auVar14,auVar87);
  auVar16 = vpermilps_avx(auVar81,0xc9);
  auVar14 = vdpps_avx(auVar16,auVar16,0x7f);
  fVar184 = auVar14._0_4_;
  auVar162._4_8_ = auVar87._4_8_;
  auVar162._0_4_ = fVar184;
  auVar162._12_4_ = 0;
  auVar15 = vrsqrtss_avx(auVar162,auVar162);
  fVar79 = auVar15._0_4_;
  auVar19 = vpermilps_avx(auVar82,0xc9);
  auVar15 = vdpps_avx(auVar16,auVar19,0x7f);
  fVar79 = fVar184 * -0.5 * fVar79 * fVar79 * fVar79 + fVar79 * 1.5;
  auVar251._0_4_ = fVar184 * auVar19._0_4_;
  auVar251._4_4_ = fVar184 * auVar19._4_4_;
  auVar251._8_4_ = fVar184 * auVar19._8_4_;
  auVar251._12_4_ = fVar184 * auVar19._12_4_;
  fVar184 = auVar15._0_4_;
  auVar188._0_4_ = fVar184 * auVar16._0_4_;
  auVar188._4_4_ = fVar184 * auVar16._4_4_;
  auVar188._8_4_ = fVar184 * auVar16._8_4_;
  auVar188._12_4_ = fVar184 * auVar16._12_4_;
  auVar19 = vsubps_avx(auVar251,auVar188);
  auVar15 = vrcpss_avx(auVar162,auVar162);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar142 = auVar15._0_4_ * auVar14._0_4_;
  auVar20 = vpermilps_avx(auVar96,0xc9);
  auVar15 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar119 = auVar16._0_4_ * fVar79;
  fVar138 = auVar16._4_4_ * fVar79;
  fVar139 = auVar16._8_4_ * fVar79;
  fVar140 = auVar16._12_4_ * fVar79;
  auVar14 = vblendps_avx(auVar15,_DAT_01feba10,0xe);
  auVar16 = vrsqrtss_avx(auVar14,auVar14);
  fVar200 = auVar15._0_4_;
  fVar184 = auVar16._0_4_;
  fVar184 = fVar184 * 1.5 + fVar200 * -0.5 * fVar184 * fVar184 * fVar184;
  auVar21 = vpermilps_avx(auVar97,0xc9);
  auVar16 = vdpps_avx(auVar20,auVar21,0x7f);
  auVar234._0_4_ = auVar21._0_4_ * fVar200;
  auVar234._4_4_ = auVar21._4_4_ * fVar200;
  auVar234._8_4_ = auVar21._8_4_ * fVar200;
  auVar234._12_4_ = auVar21._12_4_ * fVar200;
  fVar200 = auVar16._0_4_;
  auVar320._0_4_ = fVar200 * auVar20._0_4_;
  auVar320._4_4_ = fVar200 * auVar20._4_4_;
  auVar320._8_4_ = fVar200 * auVar20._8_4_;
  auVar320._12_4_ = fVar200 * auVar20._12_4_;
  auVar16 = vsubps_avx(auVar234,auVar320);
  auVar14 = vrcpss_avx(auVar14,auVar14);
  auVar93 = SUB6416(ZEXT464(0x40000000),0);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,auVar93);
  fVar200 = auVar14._0_4_ * auVar15._0_4_;
  fVar159 = auVar20._0_4_ * fVar184;
  fVar181 = auVar20._4_4_ * fVar184;
  fVar182 = auVar20._8_4_ * fVar184;
  fVar183 = auVar20._12_4_ * fVar184;
  auVar14 = vshufps_avx(auVar120,auVar120,0xff);
  auVar15 = vshufps_avx(auVar22,auVar22,0xff);
  auVar252._0_4_ = auVar15._0_4_ * fVar119;
  auVar252._4_4_ = auVar15._4_4_ * fVar138;
  auVar252._8_4_ = auVar15._8_4_ * fVar139;
  auVar252._12_4_ = auVar15._12_4_ * fVar140;
  auVar88._0_4_ = auVar14._0_4_ * fVar119 + auVar15._0_4_ * fVar79 * fVar142 * auVar19._0_4_;
  auVar88._4_4_ = auVar14._4_4_ * fVar138 + auVar15._4_4_ * fVar79 * fVar142 * auVar19._4_4_;
  auVar88._8_4_ = auVar14._8_4_ * fVar139 + auVar15._8_4_ * fVar79 * fVar142 * auVar19._8_4_;
  auVar88._12_4_ = auVar14._12_4_ * fVar140 + auVar15._12_4_ * fVar79 * fVar142 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar22,auVar252);
  local_598._0_4_ = auVar22._0_4_ + auVar252._0_4_;
  local_598._4_4_ = auVar22._4_4_ + auVar252._4_4_;
  fStack_590 = auVar22._8_4_ + auVar252._8_4_;
  fStack_58c = auVar22._12_4_ + auVar252._12_4_;
  auVar20 = vsubps_avx(auVar120,auVar88);
  auVar14 = vshufps_avx(auVar121,auVar121,0xff);
  auVar15 = vshufps_avx(auVar319,auVar319,0xff);
  auVar163._0_4_ = auVar15._0_4_ * fVar159;
  auVar163._4_4_ = auVar15._4_4_ * fVar181;
  auVar163._8_4_ = auVar15._8_4_ * fVar182;
  auVar163._12_4_ = auVar15._12_4_ * fVar183;
  auVar146._0_4_ = auVar14._0_4_ * fVar159 + auVar15._0_4_ * fVar184 * auVar16._0_4_ * fVar200;
  auVar146._4_4_ = auVar14._4_4_ * fVar181 + auVar15._4_4_ * fVar184 * auVar16._4_4_ * fVar200;
  auVar146._8_4_ = auVar14._8_4_ * fVar182 + auVar15._8_4_ * fVar184 * auVar16._8_4_ * fVar200;
  auVar146._12_4_ = auVar14._12_4_ * fVar183 + auVar15._12_4_ * fVar184 * auVar16._12_4_ * fVar200;
  auVar16 = vsubps_avx(auVar319,auVar163);
  local_618._4_4_ = auVar319._4_4_ + auVar163._4_4_;
  local_618._0_4_ = auVar319._0_4_ + auVar163._0_4_;
  fStack_610 = auVar319._8_4_ + auVar163._8_4_;
  fStack_60c = auVar319._12_4_ + auVar163._12_4_;
  auVar21 = vsubps_avx(auVar121,auVar146);
  auVar89._8_4_ = 0x3e2aaaab;
  auVar89._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar89._12_4_ = 0x3e2aaaab;
  local_4b8 = auVar64._0_4_;
  fStack_4b4 = auVar64._4_4_;
  fStack_4b0 = auVar64._8_4_;
  auVar321._0_4_ = local_4b8 * 0.16666667;
  auVar321._4_4_ = fStack_4b4 * 0.16666667;
  auVar321._8_4_ = fStack_4b0 * 0.16666667;
  auVar321._12_4_ = fVar141 * 0.16666667;
  auVar122._8_4_ = 0x3f2aaaab;
  auVar122._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar122._12_4_ = 0x3f2aaaab;
  auVar14 = vfmadd231ps_fma(auVar321,auVar122,auVar17);
  auVar15 = vfmadd231ps_fma(auVar83,auVar18,auVar122);
  auVar14 = vfmadd231ps_fma(auVar14,auVar18,auVar89);
  auVar22 = vfmadd231ps_fma(auVar15,auVar164,auVar89);
  auVar319 = vfmadd231ps_fma(auVar14,auVar164,ZEXT816(0) << 0x20);
  auVar18 = vpermilps_avx(auVar98,0xc9);
  auVar14 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar184 = auVar14._0_4_;
  auVar164 = ZEXT416((uint)fVar184);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar15 = vrsqrtss_avx(auVar164,auVar164);
  fVar79 = auVar15._0_4_;
  auVar17 = vpermilps_avx(auVar31,0xc9);
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  fVar79 = fVar79 * 1.5 + fVar79 * fVar79 * fVar184 * -0.5 * fVar79;
  auVar235._0_4_ = auVar17._0_4_ * fVar184;
  auVar235._4_4_ = auVar17._4_4_ * fVar184;
  auVar235._8_4_ = auVar17._8_4_ * fVar184;
  auVar235._12_4_ = auVar17._12_4_ * fVar184;
  fVar184 = auVar15._0_4_;
  auVar253._0_4_ = fVar184 * auVar18._0_4_;
  auVar253._4_4_ = fVar184 * auVar18._4_4_;
  auVar253._8_4_ = fVar184 * auVar18._8_4_;
  auVar253._12_4_ = fVar184 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar235,auVar253);
  auVar15 = vrcpss_avx(auVar164,auVar164);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,auVar93);
  fVar142 = auVar15._0_4_ * auVar14._0_4_;
  auVar164 = vpermilps_avx(auVar104,0xc9);
  auVar14 = vdpps_avx(auVar164,auVar164,0x7f);
  fVar141 = auVar18._0_4_ * fVar79;
  fVar119 = auVar18._4_4_ * fVar79;
  fVar138 = auVar18._8_4_ * fVar79;
  fVar139 = auVar18._12_4_ * fVar79;
  fVar200 = auVar14._0_4_;
  auVar165._4_12_ = SUB1612(auVar55 << 0x40,4);
  auVar165._0_4_ = fVar200;
  auVar15 = vrsqrtss_avx(auVar165,auVar165);
  fVar184 = auVar15._0_4_;
  fVar184 = fVar200 * -0.5 * fVar184 * fVar184 * fVar184 + fVar184 * 1.5;
  auVar18 = vpermilps_avx(auVar258,0xc9);
  auVar15 = vdpps_avx(auVar164,auVar18,0x7f);
  auVar297._0_4_ = fVar200 * auVar18._0_4_;
  auVar297._4_4_ = fVar200 * auVar18._4_4_;
  auVar297._8_4_ = fVar200 * auVar18._8_4_;
  auVar297._12_4_ = fVar200 * auVar18._12_4_;
  fVar200 = auVar15._0_4_;
  auVar337._0_4_ = fVar200 * auVar164._0_4_;
  auVar337._4_4_ = fVar200 * auVar164._4_4_;
  auVar337._8_4_ = fVar200 * auVar164._8_4_;
  auVar337._12_4_ = fVar200 * auVar164._12_4_;
  auVar18 = vsubps_avx(auVar297,auVar337);
  auVar15 = vrcpss_avx(auVar165,auVar165);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,auVar93);
  fVar200 = auVar14._0_4_ * auVar15._0_4_;
  fVar140 = auVar164._0_4_ * fVar184;
  fVar159 = auVar164._4_4_ * fVar184;
  fVar181 = auVar164._8_4_ * fVar184;
  fVar182 = auVar164._12_4_ * fVar184;
  auVar14 = vshufps_avx(auVar160,auVar160,0xff);
  auVar15 = vshufps_avx(auVar22,auVar22,0xff);
  auVar147._0_4_ = auVar15._0_4_ * fVar141;
  auVar147._4_4_ = auVar15._4_4_ * fVar119;
  auVar147._8_4_ = auVar15._8_4_ * fVar138;
  auVar147._12_4_ = auVar15._12_4_ * fVar139;
  auVar107._0_4_ = auVar14._0_4_ * fVar141 + auVar15._0_4_ * fVar79 * fVar142 * auVar17._0_4_;
  auVar107._4_4_ = auVar14._4_4_ * fVar119 + auVar15._4_4_ * fVar79 * fVar142 * auVar17._4_4_;
  auVar107._8_4_ = auVar14._8_4_ * fVar138 + auVar15._8_4_ * fVar79 * fVar142 * auVar17._8_4_;
  auVar107._12_4_ = auVar14._12_4_ * fVar139 + auVar15._12_4_ * fVar79 * fVar142 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar22,auVar147);
  fVar142 = auVar22._0_4_ + auVar147._0_4_;
  fVar141 = auVar22._4_4_ + auVar147._4_4_;
  fVar119 = auVar22._8_4_ + auVar147._8_4_;
  fVar138 = auVar22._12_4_ + auVar147._12_4_;
  auVar164 = vsubps_avx(auVar160,auVar107);
  auVar14 = vshufps_avx(auVar171,auVar171,0xff);
  auVar15 = vshufps_avx(auVar319,auVar319,0xff);
  auVar272._0_4_ = auVar15._0_4_ * fVar140;
  auVar272._4_4_ = auVar15._4_4_ * fVar159;
  auVar272._8_4_ = auVar15._8_4_ * fVar181;
  auVar272._12_4_ = auVar15._12_4_ * fVar182;
  auVar108._0_4_ = auVar14._0_4_ * fVar140 + auVar15._0_4_ * fVar184 * auVar18._0_4_ * fVar200;
  auVar108._4_4_ = auVar14._4_4_ * fVar159 + auVar15._4_4_ * fVar184 * auVar18._4_4_ * fVar200;
  auVar108._8_4_ = auVar14._8_4_ * fVar181 + auVar15._8_4_ * fVar184 * auVar18._8_4_ * fVar200;
  auVar108._12_4_ = auVar14._12_4_ * fVar182 + auVar15._12_4_ * fVar184 * auVar18._12_4_ * fVar200;
  auVar14 = vsubps_avx(auVar319,auVar272);
  auVar166._0_4_ = auVar319._0_4_ + auVar272._0_4_;
  auVar166._4_4_ = auVar319._4_4_ + auVar272._4_4_;
  auVar166._8_4_ = auVar319._8_4_ + auVar272._8_4_;
  auVar166._12_4_ = auVar319._12_4_ + auVar272._12_4_;
  auVar15 = vsubps_avx(auVar171,auVar108);
  local_5e8._0_4_ = auVar20._0_4_;
  local_5e8._4_4_ = auVar20._4_4_;
  fStack_5e0 = auVar20._8_4_;
  fStack_5dc = auVar20._12_4_;
  auVar208._0_4_ = auVar19._0_4_ + (float)local_5e8._0_4_ * 0.33333334;
  auVar208._4_4_ = auVar19._4_4_ + (float)local_5e8._4_4_ * 0.33333334;
  auVar208._8_4_ = auVar19._8_4_ + fStack_5e0 * 0.33333334;
  auVar208._12_4_ = auVar19._12_4_ + fStack_5dc * 0.33333334;
  fVar79 = 1.0 - fVar199;
  auVar109._4_4_ = fVar79;
  auVar109._0_4_ = fVar79;
  auVar109._8_4_ = fVar79;
  auVar109._12_4_ = fVar79;
  auVar298._0_4_ = fVar199 * auVar17._0_4_;
  auVar298._4_4_ = fVar199 * auVar17._4_4_;
  auVar298._8_4_ = fVar199 * auVar17._8_4_;
  auVar298._12_4_ = fVar199 * auVar17._12_4_;
  local_3f8 = vfmadd231ps_fma(auVar298,auVar109,auVar19);
  auVar123._0_4_ = fVar199 * (auVar17._0_4_ + auVar164._0_4_ * 0.33333334);
  auVar123._4_4_ = fVar199 * (auVar17._4_4_ + auVar164._4_4_ * 0.33333334);
  auVar123._8_4_ = fVar199 * (auVar17._8_4_ + auVar164._8_4_ * 0.33333334);
  auVar123._12_4_ = fVar199 * (auVar17._12_4_ + auVar164._12_4_ * 0.33333334);
  auVar19 = vfmadd231ps_fma(auVar123,auVar109,auVar208);
  local_628 = auVar21._0_4_;
  fStack_624 = auVar21._4_4_;
  fStack_620 = auVar21._8_4_;
  fStack_61c = auVar21._12_4_;
  auVar124._0_4_ = local_628 * 0.33333334;
  auVar124._4_4_ = fStack_624 * 0.33333334;
  auVar124._8_4_ = fStack_620 * 0.33333334;
  auVar124._12_4_ = fStack_61c * 0.33333334;
  auVar17 = vsubps_avx(auVar16,auVar124);
  auVar322._0_4_ = (float)local_598._0_4_ + (fVar293 + auVar88._0_4_) * 0.33333334;
  auVar322._4_4_ = (float)local_598._4_4_ + (fVar227 + auVar88._4_4_) * 0.33333334;
  auVar322._8_4_ = fStack_590 + (fVar294 + auVar88._8_4_) * 0.33333334;
  auVar322._12_4_ = fStack_58c + (fVar228 + auVar88._12_4_) * 0.33333334;
  auVar282._0_4_ = (fVar295 + auVar146._0_4_) * 0.33333334;
  auVar282._4_4_ = (fVar229 + auVar146._4_4_) * 0.33333334;
  auVar282._8_4_ = (fVar230 + auVar146._8_4_) * 0.33333334;
  auVar282._12_4_ = (fVar247 + auVar146._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_618,auVar282);
  auVar299._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar299._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar299._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar299._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar14,auVar299);
  auVar254._0_4_ = (fVar280 + auVar108._0_4_) * 0.33333334;
  auVar254._4_4_ = (fVar201 + auVar108._4_4_) * 0.33333334;
  auVar254._8_4_ = (fVar290 + auVar108._8_4_) * 0.33333334;
  auVar254._12_4_ = (fVar224 + auVar108._12_4_) * 0.33333334;
  auVar164 = vsubps_avx(auVar166,auVar254);
  auVar300._0_4_ = fVar199 * auVar15._0_4_;
  auVar300._4_4_ = fVar199 * auVar15._4_4_;
  auVar300._8_4_ = fVar199 * auVar15._8_4_;
  auVar300._12_4_ = fVar199 * auVar15._12_4_;
  auVar236._0_4_ = fVar199 * auVar14._0_4_;
  auVar236._4_4_ = fVar199 * auVar14._4_4_;
  auVar236._8_4_ = fVar199 * auVar14._8_4_;
  auVar236._12_4_ = fVar199 * auVar14._12_4_;
  local_408 = vfmadd231ps_fma(auVar300,auVar109,auVar17);
  local_418 = vfmadd231ps_fma(auVar236,auVar109,auVar16);
  auVar125._0_4_ = fVar199 * fVar142;
  auVar125._4_4_ = fVar199 * fVar141;
  auVar125._8_4_ = fVar199 * fVar119;
  auVar125._12_4_ = fVar199 * fVar138;
  auVar148._0_4_ = fVar199 * (fVar142 + (fVar291 + auVar107._0_4_) * 0.33333334);
  auVar148._4_4_ = fVar199 * (fVar141 + (fVar225 + auVar107._4_4_) * 0.33333334);
  auVar148._8_4_ = fVar199 * (fVar119 + (fVar292 + auVar107._8_4_) * 0.33333334);
  auVar148._12_4_ = fVar199 * (fVar138 + (fVar226 + auVar107._12_4_) * 0.33333334);
  auVar189._0_4_ = fVar199 * auVar164._0_4_;
  auVar189._4_4_ = fVar199 * auVar164._4_4_;
  auVar189._8_4_ = fVar199 * auVar164._8_4_;
  auVar189._12_4_ = fVar199 * auVar164._12_4_;
  auVar167._0_4_ = fVar199 * auVar166._0_4_;
  auVar167._4_4_ = fVar199 * auVar166._4_4_;
  auVar167._8_4_ = fVar199 * auVar166._8_4_;
  auVar167._12_4_ = fVar199 * auVar166._12_4_;
  _local_428 = vfmadd231ps_fma(auVar125,auVar109,_local_598);
  auVar20 = vfmadd231ps_fma(auVar148,auVar109,auVar322);
  _local_438 = vfmadd231ps_fma(auVar189,auVar109,auVar18);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar21 = vfmadd231ps_fma(auVar167,auVar109,_local_618);
  local_3d8 = vsubps_avx(local_3f8,auVar14);
  auVar15 = vshufps_avx(local_3d8,local_3d8,0x55);
  auVar16 = vshufps_avx(local_3d8,local_3d8,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar79 = pre->ray_space[k].vz.field_0.m128[0];
  fVar184 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = pre->ray_space[k].vz.field_0.m128[2];
  fVar142 = pre->ray_space[k].vz.field_0.m128[3];
  auVar90._0_4_ = fVar79 * auVar16._0_4_;
  auVar90._4_4_ = fVar184 * auVar16._4_4_;
  auVar90._8_4_ = fVar199 * auVar16._8_4_;
  auVar90._12_4_ = fVar142 * auVar16._12_4_;
  auVar17 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar5,auVar15);
  local_3e8 = vsubps_avx(auVar19,auVar14);
  auVar15 = vshufps_avx(local_3e8,local_3e8,0x55);
  auVar16 = vshufps_avx(local_3e8,local_3e8,0xaa);
  auVar344._0_4_ = fVar79 * auVar16._0_4_;
  auVar344._4_4_ = fVar184 * auVar16._4_4_;
  auVar344._8_4_ = fVar199 * auVar16._8_4_;
  auVar344._12_4_ = fVar142 * auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar344,(undefined1  [16])aVar5,auVar15);
  local_288 = vsubps_avx(local_408,auVar14);
  auVar15 = vshufps_avx(local_288,local_288,0xaa);
  auVar338._0_4_ = fVar79 * auVar15._0_4_;
  auVar338._4_4_ = fVar184 * auVar15._4_4_;
  auVar338._8_4_ = fVar199 * auVar15._8_4_;
  auVar338._12_4_ = fVar142 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_288,local_288,0x55);
  auVar18 = vfmadd231ps_fma(auVar338,(undefined1  [16])aVar5,auVar15);
  local_298 = vsubps_avx(local_418,auVar14);
  auVar15 = vshufps_avx(local_298,local_298,0xaa);
  auVar323._0_4_ = fVar79 * auVar15._0_4_;
  auVar323._4_4_ = fVar184 * auVar15._4_4_;
  auVar323._8_4_ = fVar199 * auVar15._8_4_;
  auVar323._12_4_ = fVar142 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_298,local_298,0x55);
  auVar164 = vfmadd231ps_fma(auVar323,(undefined1  [16])aVar5,auVar15);
  local_2a8 = vsubps_avx(_local_428,auVar14);
  auVar15 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar168._0_4_ = fVar79 * auVar15._0_4_;
  auVar168._4_4_ = fVar184 * auVar15._4_4_;
  auVar168._8_4_ = fVar199 * auVar15._8_4_;
  auVar168._12_4_ = fVar142 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2a8,local_2a8,0x55);
  auVar22 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar15);
  local_2b8 = vsubps_avx(auVar20,auVar14);
  auVar15 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar237._0_4_ = fVar79 * auVar15._0_4_;
  auVar237._4_4_ = fVar184 * auVar15._4_4_;
  auVar237._8_4_ = fVar199 * auVar15._8_4_;
  auVar237._12_4_ = fVar142 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar319 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar5,auVar15);
  local_2c8 = vsubps_avx(_local_438,auVar14);
  auVar15 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar273._0_4_ = fVar79 * auVar15._0_4_;
  auVar273._4_4_ = fVar184 * auVar15._4_4_;
  auVar273._8_4_ = fVar199 * auVar15._8_4_;
  auVar273._12_4_ = fVar142 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2c8,local_2c8,0x55);
  auVar15 = vfmadd231ps_fma(auVar273,(undefined1  [16])aVar5,auVar15);
  local_2d8 = vsubps_avx(auVar21,auVar14);
  auVar14 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar190._0_4_ = fVar79 * auVar14._0_4_;
  auVar190._4_4_ = fVar184 * auVar14._4_4_;
  auVar190._8_4_ = fVar199 * auVar14._8_4_;
  auVar190._12_4_ = fVar142 * auVar14._12_4_;
  auVar14 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar14 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar14);
  auVar209._4_4_ = local_3d8._0_4_;
  auVar209._0_4_ = local_3d8._0_4_;
  auVar209._8_4_ = local_3d8._0_4_;
  auVar209._12_4_ = local_3d8._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar31 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar209);
  auVar210._4_4_ = local_3e8._0_4_;
  auVar210._0_4_ = local_3e8._0_4_;
  auVar210._8_4_ = local_3e8._0_4_;
  auVar210._12_4_ = local_3e8._0_4_;
  auVar93 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar210);
  uVar80 = local_288._0_4_;
  auVar211._4_4_ = uVar80;
  auVar211._0_4_ = uVar80;
  auVar211._8_4_ = uVar80;
  auVar211._12_4_ = uVar80;
  auVar83 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar211);
  uVar80 = local_298._0_4_;
  auVar212._4_4_ = uVar80;
  auVar212._0_4_ = uVar80;
  auVar212._8_4_ = uVar80;
  auVar212._12_4_ = uVar80;
  auVar81 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar5,auVar212);
  uVar80 = local_2a8._0_4_;
  auVar213._4_4_ = uVar80;
  auVar213._0_4_ = uVar80;
  auVar213._8_4_ = uVar80;
  auVar213._12_4_ = uVar80;
  auVar22 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar5,auVar213);
  uVar80 = local_2b8._0_4_;
  auVar214._4_4_ = uVar80;
  auVar214._0_4_ = uVar80;
  auVar214._8_4_ = uVar80;
  auVar214._12_4_ = uVar80;
  auVar319 = vfmadd231ps_fma(auVar319,(undefined1  [16])aVar5,auVar214);
  uVar80 = local_2c8._0_4_;
  auVar215._4_4_ = uVar80;
  auVar215._0_4_ = uVar80;
  auVar215._8_4_ = uVar80;
  auVar215._12_4_ = uVar80;
  auVar82 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar215);
  uVar80 = local_2d8._0_4_;
  auVar216._4_4_ = uVar80;
  auVar216._0_4_ = uVar80;
  auVar216._8_4_ = uVar80;
  auVar216._12_4_ = uVar80;
  auVar96 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar216);
  auVar17 = vmovlhps_avx(auVar31,auVar22);
  auVar18 = vmovlhps_avx(auVar93,auVar319);
  auVar164 = vmovlhps_avx(auVar83,auVar82);
  _local_3c8 = vmovlhps_avx(auVar81,auVar96);
  auVar14 = vminps_avx(auVar17,auVar18);
  auVar15 = vminps_avx(auVar164,_local_3c8);
  auVar16 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar17,auVar18);
  auVar15 = vmaxps_avx(auVar164,_local_3c8);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vshufpd_avx(auVar16,auVar16,3);
  auVar16 = vminps_avx(auVar16,auVar15);
  auVar15 = vshufpd_avx(auVar14,auVar14,3);
  auVar15 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vandps_avx(auVar16,auVar336);
  auVar15 = vandps_avx(auVar15,auVar336);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vmovshdup_avx(auVar14);
  auVar14 = vmaxss_avx(auVar15,auVar14);
  local_178 = auVar14._0_4_ * 9.536743e-07;
  auVar217._8_8_ = auVar31._0_8_;
  auVar217._0_8_ = auVar31._0_8_;
  auVar255._8_8_ = auVar93._0_8_;
  auVar255._0_8_ = auVar93._0_8_;
  auVar283._8_8_ = auVar83._0_8_;
  auVar283._0_8_ = auVar83._0_8_;
  auVar324._0_8_ = auVar81._0_8_;
  auVar324._8_8_ = auVar324._0_8_;
  local_278 = ZEXT416((uint)local_178);
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_168 = local_178;
  fStack_164 = local_178;
  fStack_160 = local_178;
  fStack_15c = local_178;
  local_198 = -local_178;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_308 = uVar69;
  uStack_304 = uVar69;
  uStack_300 = uVar69;
  uStack_2fc = uVar69;
  uStack_314 = local_318;
  uStack_310 = local_318;
  uStack_30c = local_318;
  uVar76 = 0;
  uVar70 = 0;
  fVar79 = *(float *)(ray + k * 4 + 0x30);
  auVar14 = vsubps_avx(auVar18,auVar17);
  auVar15 = vsubps_avx(auVar164,auVar18);
  auVar16 = vsubps_avx(_local_3c8,auVar164);
  local_328 = vsubps_avx(_local_428,local_3f8);
  local_338 = vsubps_avx(auVar20,auVar19);
  local_348 = vsubps_avx(_local_438,local_408);
  _local_358 = vsubps_avx(auVar21,local_418);
  local_668 = ZEXT816(0x3f80000000000000);
  local_2e8 = local_668;
  do {
    auVar31 = vshufps_avx(local_668,local_668,0x50);
    auVar149._8_4_ = 0x3f800000;
    auVar149._0_8_ = &DAT_3f8000003f800000;
    auVar149._12_4_ = 0x3f800000;
    auVar156._16_4_ = 0x3f800000;
    auVar156._0_16_ = auVar149;
    auVar156._20_4_ = 0x3f800000;
    auVar156._24_4_ = 0x3f800000;
    auVar156._28_4_ = 0x3f800000;
    auVar93 = vsubps_avx(auVar149,auVar31);
    fVar184 = auVar31._0_4_;
    fVar140 = auVar22._0_4_;
    auVar91._0_4_ = fVar140 * fVar184;
    fVar199 = auVar31._4_4_;
    fVar159 = auVar22._4_4_;
    auVar91._4_4_ = fVar159 * fVar199;
    fVar142 = auVar31._8_4_;
    auVar91._8_4_ = fVar140 * fVar142;
    fVar200 = auVar31._12_4_;
    auVar91._12_4_ = fVar159 * fVar200;
    fVar230 = auVar319._0_4_;
    auVar191._0_4_ = fVar230 * fVar184;
    fVar247 = auVar319._4_4_;
    auVar191._4_4_ = fVar247 * fVar199;
    auVar191._8_4_ = fVar230 * fVar142;
    auVar191._12_4_ = fVar247 * fVar200;
    fVar269 = auVar82._0_4_;
    auVar238._0_4_ = fVar269 * fVar184;
    fVar279 = auVar82._4_4_;
    auVar238._4_4_ = fVar279 * fVar199;
    auVar238._8_4_ = fVar269 * fVar142;
    auVar238._12_4_ = fVar279 * fVar200;
    fVar333 = auVar96._0_4_;
    auVar309._0_4_ = fVar333 * fVar184;
    fVar343 = auVar96._4_4_;
    auVar309._4_4_ = fVar343 * fVar199;
    auVar309._8_4_ = fVar333 * fVar142;
    auVar309._12_4_ = fVar343 * fVar200;
    auVar97 = vfmadd231ps_fma(auVar91,auVar93,auVar217);
    auVar98 = vfmadd231ps_fma(auVar191,auVar93,auVar255);
    auVar104 = vfmadd231ps_fma(auVar238,auVar93,auVar283);
    auVar258 = vfmadd231ps_fma(auVar309,auVar324,auVar93);
    local_5b8 = auVar258._0_4_;
    auVar31 = vmovshdup_avx(local_2e8);
    fVar184 = local_2e8._0_4_;
    fVar141 = (auVar31._0_4_ - fVar184) * 0.04761905;
    auVar268._4_4_ = fVar184;
    auVar268._0_4_ = fVar184;
    auVar268._8_4_ = fVar184;
    auVar268._12_4_ = fVar184;
    auVar268._16_4_ = fVar184;
    auVar268._20_4_ = fVar184;
    auVar268._24_4_ = fVar184;
    auVar268._28_4_ = fVar184;
    auVar135._0_8_ = auVar31._0_8_;
    auVar135._8_8_ = auVar135._0_8_;
    auVar135._16_8_ = auVar135._0_8_;
    auVar135._24_8_ = auVar135._0_8_;
    auVar95 = vsubps_avx(auVar135,auVar268);
    uVar80 = auVar97._0_4_;
    auVar348._4_4_ = uVar80;
    auVar348._0_4_ = uVar80;
    auVar348._8_4_ = uVar80;
    auVar348._12_4_ = uVar80;
    auVar348._16_4_ = uVar80;
    auVar348._20_4_ = uVar80;
    auVar348._24_4_ = uVar80;
    auVar348._28_4_ = uVar80;
    auVar31 = vmovshdup_avx(auVar97);
    uVar202 = auVar31._0_8_;
    auVar331._8_8_ = uVar202;
    auVar331._0_8_ = uVar202;
    auVar331._16_8_ = uVar202;
    auVar331._24_8_ = uVar202;
    fVar119 = auVar98._0_4_;
    auVar117._4_4_ = fVar119;
    auVar117._0_4_ = fVar119;
    auVar117._8_4_ = fVar119;
    auVar117._12_4_ = fVar119;
    auVar117._16_4_ = fVar119;
    auVar117._20_4_ = fVar119;
    auVar117._24_4_ = fVar119;
    auVar117._28_4_ = fVar119;
    auVar93 = vmovshdup_avx(auVar98);
    auVar221._0_8_ = auVar93._0_8_;
    auVar221._8_8_ = auVar221._0_8_;
    auVar221._16_8_ = auVar221._0_8_;
    auVar221._24_8_ = auVar221._0_8_;
    fVar181 = auVar104._0_4_;
    auVar307._4_4_ = fVar181;
    auVar307._0_4_ = fVar181;
    auVar307._8_4_ = fVar181;
    auVar307._12_4_ = fVar181;
    auVar307._16_4_ = fVar181;
    auVar307._20_4_ = fVar181;
    auVar307._24_4_ = fVar181;
    auVar307._28_4_ = fVar181;
    auVar83 = vmovshdup_avx(auVar104);
    auVar278._0_8_ = auVar83._0_8_;
    auVar278._8_8_ = auVar278._0_8_;
    auVar278._16_8_ = auVar278._0_8_;
    auVar278._24_8_ = auVar278._0_8_;
    auVar81 = vmovshdup_avx(auVar258);
    auVar120 = vfmadd132ps_fma(auVar95,auVar268,_DAT_02020f20);
    auVar95 = vsubps_avx(auVar156,ZEXT1632(auVar120));
    fVar184 = auVar120._0_4_;
    auVar340._0_4_ = fVar119 * fVar184;
    fVar199 = auVar120._4_4_;
    auVar340._4_4_ = fVar119 * fVar199;
    fVar142 = auVar120._8_4_;
    auVar340._8_4_ = fVar119 * fVar142;
    fVar200 = auVar120._12_4_;
    auVar340._12_4_ = fVar119 * fVar200;
    auVar340._16_4_ = fVar119 * 0.0;
    auVar340._20_4_ = fVar119 * 0.0;
    auVar340._24_4_ = fVar119 * 0.0;
    auVar340._28_4_ = 0;
    auVar120 = vfmadd231ps_fma(auVar340,auVar95,auVar348);
    fVar138 = auVar93._0_4_;
    auVar316._0_4_ = fVar138 * fVar184;
    fVar139 = auVar93._4_4_;
    auVar316._4_4_ = fVar139 * fVar199;
    auVar316._8_4_ = fVar138 * fVar142;
    auVar316._12_4_ = fVar139 * fVar200;
    auVar316._16_4_ = fVar138 * 0.0;
    auVar316._20_4_ = fVar139 * 0.0;
    auVar316._24_4_ = fVar138 * 0.0;
    auVar316._28_4_ = 0;
    auVar121 = vfmadd231ps_fma(auVar316,auVar95,auVar331);
    auVar23._4_4_ = fVar181 * fVar199;
    auVar23._0_4_ = fVar181 * fVar184;
    auVar23._8_4_ = fVar181 * fVar142;
    auVar23._12_4_ = fVar181 * fVar200;
    auVar23._16_4_ = fVar181 * 0.0;
    auVar23._20_4_ = fVar181 * 0.0;
    auVar23._24_4_ = fVar181 * 0.0;
    auVar23._28_4_ = auVar31._4_4_;
    auVar160 = vfmadd231ps_fma(auVar23,auVar95,auVar117);
    fVar138 = auVar83._0_4_;
    fVar139 = auVar83._4_4_;
    auVar24._4_4_ = fVar139 * fVar199;
    auVar24._0_4_ = fVar138 * fVar184;
    auVar24._8_4_ = fVar138 * fVar142;
    auVar24._12_4_ = fVar139 * fVar200;
    auVar24._16_4_ = fVar138 * 0.0;
    auVar24._20_4_ = fVar139 * 0.0;
    auVar24._24_4_ = fVar138 * 0.0;
    auVar24._28_4_ = uVar80;
    auVar171 = vfmadd231ps_fma(auVar24,auVar95,auVar221);
    auVar31 = vshufps_avx(auVar97,auVar97,0xaa);
    auVar222._0_8_ = auVar31._0_8_;
    auVar222._8_8_ = auVar222._0_8_;
    auVar222._16_8_ = auVar222._0_8_;
    auVar222._24_8_ = auVar222._0_8_;
    auVar93 = vshufps_avx(auVar97,auVar97,0xff);
    uStack_650 = auVar93._0_8_;
    local_658 = (undefined1  [8])uStack_650;
    uStack_648 = uStack_650;
    uStack_640 = uStack_650;
    auVar25._4_4_ = fVar199 * local_5b8;
    auVar25._0_4_ = fVar184 * local_5b8;
    auVar25._8_4_ = fVar142 * local_5b8;
    auVar25._12_4_ = fVar200 * local_5b8;
    auVar25._16_4_ = local_5b8 * 0.0;
    auVar25._20_4_ = local_5b8 * 0.0;
    auVar25._24_4_ = local_5b8 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar203 = vfmadd231ps_fma(auVar25,auVar95,auVar307);
    auVar83 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar179._0_8_ = auVar83._0_8_;
    auVar179._8_8_ = auVar179._0_8_;
    auVar179._16_8_ = auVar179._0_8_;
    auVar179._24_8_ = auVar179._0_8_;
    auVar97 = vshufps_avx(auVar98,auVar98,0xff);
    auVar198._0_8_ = auVar97._0_8_;
    auVar198._8_8_ = auVar198._0_8_;
    auVar198._16_8_ = auVar198._0_8_;
    auVar198._24_8_ = auVar198._0_8_;
    fVar138 = auVar81._0_4_;
    fVar139 = auVar81._4_4_;
    auVar26._4_4_ = fVar139 * fVar199;
    auVar26._0_4_ = fVar138 * fVar184;
    auVar26._8_4_ = fVar138 * fVar142;
    auVar26._12_4_ = fVar139 * fVar200;
    auVar26._16_4_ = fVar138 * 0.0;
    auVar26._20_4_ = fVar139 * 0.0;
    auVar26._24_4_ = fVar138 * 0.0;
    auVar26._28_4_ = fVar181;
    auVar204 = vfmadd231ps_fma(auVar26,auVar95,auVar278);
    auVar27._28_4_ = fVar119;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar160._12_4_ * fVar200,
                            CONCAT48(auVar160._8_4_ * fVar142,
                                     CONCAT44(auVar160._4_4_ * fVar199,auVar160._0_4_ * fVar184))));
    auVar120 = vfmadd231ps_fma(auVar27,auVar95,ZEXT1632(auVar120));
    auVar28._28_4_ = auVar93._4_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar171._12_4_ * fVar200,
                            CONCAT48(auVar171._8_4_ * fVar142,
                                     CONCAT44(auVar171._4_4_ * fVar199,auVar171._0_4_ * fVar184))));
    auVar121 = vfmadd231ps_fma(auVar28,auVar95,ZEXT1632(auVar121));
    auVar93 = vshufps_avx(auVar104,auVar104,0xaa);
    uVar202 = auVar93._0_8_;
    auVar317._8_8_ = uVar202;
    auVar317._0_8_ = uVar202;
    auVar317._16_8_ = uVar202;
    auVar317._24_8_ = uVar202;
    auVar81 = vshufps_avx(auVar104,auVar104,0xff);
    uVar202 = auVar81._0_8_;
    auVar341._8_8_ = uVar202;
    auVar341._0_8_ = uVar202;
    auVar341._16_8_ = uVar202;
    auVar341._24_8_ = uVar202;
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar203._12_4_,
                                                  CONCAT48(fVar142 * auVar203._8_4_,
                                                           CONCAT44(fVar199 * auVar203._4_4_,
                                                                    fVar184 * auVar203._0_4_)))),
                               auVar95,ZEXT1632(auVar160));
    auVar98 = vshufps_avx(auVar258,auVar258,0xaa);
    auVar104 = vshufps_avx(auVar258,auVar258,0xff);
    local_5b8 = auVar104._0_4_;
    fStack_5b4 = auVar104._4_4_;
    auVar29._28_4_ = fStack_5b4;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar204._12_4_ * fVar200,
                            CONCAT48(auVar204._8_4_ * fVar142,
                                     CONCAT44(auVar204._4_4_ * fVar199,auVar204._0_4_ * fVar184))));
    auVar104 = vfmadd231ps_fma(auVar29,auVar95,ZEXT1632(auVar171));
    auVar258 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar160._12_4_,
                                                  CONCAT48(fVar142 * auVar160._8_4_,
                                                           CONCAT44(fVar199 * auVar160._4_4_,
                                                                    fVar184 * auVar160._0_4_)))),
                               auVar95,ZEXT1632(auVar120));
    auVar23 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar120));
    auVar120 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar104._12_4_,
                                                  CONCAT48(fVar142 * auVar104._8_4_,
                                                           CONCAT44(fVar199 * auVar104._4_4_,
                                                                    fVar184 * auVar104._0_4_)))),
                               auVar95,ZEXT1632(auVar121));
    auVar24 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar121));
    fVar280 = fVar141 * auVar23._0_4_ * 3.0;
    fVar290 = fVar141 * auVar23._4_4_ * 3.0;
    auVar30._4_4_ = fVar290;
    auVar30._0_4_ = fVar280;
    fVar291 = fVar141 * auVar23._8_4_ * 3.0;
    auVar30._8_4_ = fVar291;
    fVar292 = fVar141 * auVar23._12_4_ * 3.0;
    auVar30._12_4_ = fVar292;
    fVar293 = fVar141 * auVar23._16_4_ * 3.0;
    auVar30._16_4_ = fVar293;
    fVar294 = fVar141 * auVar23._20_4_ * 3.0;
    auVar30._20_4_ = fVar294;
    fVar295 = fVar141 * auVar23._24_4_ * 3.0;
    auVar30._24_4_ = fVar295;
    auVar30._28_4_ = 0x40400000;
    local_5e8._0_4_ = fVar141 * auVar24._0_4_ * 3.0;
    local_5e8._4_4_ = fVar141 * auVar24._4_4_ * 3.0;
    fStack_5e0 = fVar141 * auVar24._8_4_ * 3.0;
    fStack_5dc = fVar141 * auVar24._12_4_ * 3.0;
    fStack_5d8 = fVar141 * auVar24._16_4_ * 3.0;
    fStack_5d4 = fVar141 * auVar24._20_4_ * 3.0;
    fStack_5d0 = fVar141 * auVar24._24_4_ * 3.0;
    fStack_5cc = auVar24._28_4_;
    fVar119 = auVar83._0_4_;
    fVar138 = auVar83._4_4_;
    auVar318._4_4_ = fVar138 * fVar199;
    auVar318._0_4_ = fVar119 * fVar184;
    auVar318._8_4_ = fVar119 * fVar142;
    auVar318._12_4_ = fVar138 * fVar200;
    auVar318._16_4_ = fVar119 * 0.0;
    auVar318._20_4_ = fVar138 * 0.0;
    auVar318._24_4_ = fVar119 * 0.0;
    auVar318._28_4_ = auVar23._28_4_;
    auVar83 = vfmadd231ps_fma(auVar318,auVar95,auVar222);
    fVar119 = auVar97._0_4_;
    fVar139 = auVar97._4_4_;
    auVar32._4_4_ = fVar139 * fVar199;
    auVar32._0_4_ = fVar119 * fVar184;
    auVar32._8_4_ = fVar119 * fVar142;
    auVar32._12_4_ = fVar139 * fVar200;
    auVar32._16_4_ = fVar119 * 0.0;
    auVar32._20_4_ = fVar139 * 0.0;
    auVar32._24_4_ = fVar119 * 0.0;
    auVar32._28_4_ = auVar31._4_4_;
    auVar31 = vfmadd231ps_fma(auVar32,auVar95,_local_658);
    fVar119 = auVar93._0_4_;
    fVar139 = auVar93._4_4_;
    auVar33._4_4_ = fVar139 * fVar199;
    auVar33._0_4_ = fVar119 * fVar184;
    auVar33._8_4_ = fVar119 * fVar142;
    auVar33._12_4_ = fVar139 * fVar200;
    auVar33._16_4_ = fVar119 * 0.0;
    auVar33._20_4_ = fVar139 * 0.0;
    auVar33._24_4_ = fVar119 * 0.0;
    auVar33._28_4_ = fVar141;
    auVar93 = vfmadd231ps_fma(auVar33,auVar95,auVar179);
    fVar119 = auVar81._0_4_;
    fVar181 = auVar81._4_4_;
    auVar34._4_4_ = fVar181 * fVar199;
    auVar34._0_4_ = fVar119 * fVar184;
    auVar34._8_4_ = fVar119 * fVar142;
    auVar34._12_4_ = fVar181 * fVar200;
    auVar34._16_4_ = fVar119 * 0.0;
    auVar34._20_4_ = fVar181 * 0.0;
    auVar34._24_4_ = fVar119 * 0.0;
    auVar34._28_4_ = fVar138;
    auVar81 = vfmadd231ps_fma(auVar34,auVar95,auVar198);
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar258));
    fVar119 = auVar98._0_4_;
    fVar138 = auVar98._4_4_;
    auVar35._4_4_ = fVar138 * fVar199;
    auVar35._0_4_ = fVar119 * fVar184;
    auVar35._8_4_ = fVar119 * fVar142;
    auVar35._12_4_ = fVar138 * fVar200;
    auVar35._16_4_ = fVar119 * 0.0;
    auVar35._20_4_ = fVar138 * 0.0;
    auVar35._24_4_ = fVar119 * 0.0;
    auVar35._28_4_ = auVar27._28_4_;
    auVar97 = vfmadd231ps_fma(auVar35,auVar95,auVar317);
    auVar28 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar120));
    auVar36._4_4_ = fVar199 * fStack_5b4;
    auVar36._0_4_ = fVar184 * local_5b8;
    auVar36._8_4_ = fVar142 * local_5b8;
    auVar36._12_4_ = fVar200 * fStack_5b4;
    auVar36._16_4_ = local_5b8 * 0.0;
    auVar36._20_4_ = fStack_5b4 * 0.0;
    auVar36._24_4_ = local_5b8 * 0.0;
    auVar36._28_4_ = fVar139;
    auVar98 = vfmadd231ps_fma(auVar36,auVar95,auVar341);
    auVar37._28_4_ = fVar138;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar200 * auVar93._12_4_,
                            CONCAT48(fVar142 * auVar93._8_4_,
                                     CONCAT44(fVar199 * auVar93._4_4_,fVar184 * auVar93._0_4_))));
    auVar83 = vfmadd231ps_fma(auVar37,auVar95,ZEXT1632(auVar83));
    auVar31 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar81._12_4_,
                                                 CONCAT48(fVar142 * auVar81._8_4_,
                                                          CONCAT44(fVar199 * auVar81._4_4_,
                                                                   fVar184 * auVar81._0_4_)))),
                              auVar95,ZEXT1632(auVar31));
    fVar280 = auVar258._0_4_ + fVar280;
    fVar290 = auVar258._4_4_ + fVar290;
    fVar291 = auVar258._8_4_ + fVar291;
    fVar292 = auVar258._12_4_ + fVar292;
    fVar293 = fVar293 + 0.0;
    fVar294 = fVar294 + 0.0;
    fVar295 = fVar295 + 0.0;
    auVar38._28_4_ = 0x40400000;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar98._12_4_ * fVar200,
                            CONCAT48(auVar98._8_4_ * fVar142,
                                     CONCAT44(auVar98._4_4_ * fVar199,auVar98._0_4_ * fVar184))));
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar97._12_4_,
                                                 CONCAT48(fVar142 * auVar97._8_4_,
                                                          CONCAT44(fVar199 * auVar97._4_4_,
                                                                   fVar184 * auVar97._0_4_)))),
                              auVar95,ZEXT1632(auVar93));
    auVar81 = vfmadd231ps_fma(auVar38,auVar95,ZEXT1632(auVar81));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar93._12_4_,
                                                 CONCAT48(fVar142 * auVar93._8_4_,
                                                          CONCAT44(fVar199 * auVar93._4_4_,
                                                                   fVar184 * auVar93._0_4_)))),
                              auVar95,ZEXT1632(auVar83));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar81._12_4_,
                                                 CONCAT48(fVar142 * auVar81._8_4_,
                                                          CONCAT44(fVar199 * auVar81._4_4_,
                                                                   fVar184 * auVar81._0_4_)))),
                              ZEXT1632(auVar31),auVar95);
    auVar95 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar83));
    auVar23 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar31));
    fVar184 = fVar141 * auVar95._0_4_ * 3.0;
    fVar199 = fVar141 * auVar95._4_4_ * 3.0;
    auVar39._4_4_ = fVar199;
    auVar39._0_4_ = fVar184;
    fVar142 = fVar141 * auVar95._8_4_ * 3.0;
    auVar39._8_4_ = fVar142;
    fVar200 = fVar141 * auVar95._12_4_ * 3.0;
    auVar39._12_4_ = fVar200;
    fVar181 = fVar141 * auVar95._16_4_ * 3.0;
    auVar39._16_4_ = fVar181;
    fVar182 = fVar141 * auVar95._20_4_ * 3.0;
    auVar39._20_4_ = fVar182;
    fVar183 = fVar141 * auVar95._24_4_ * 3.0;
    auVar39._24_4_ = fVar183;
    auVar39._28_4_ = 0x40400000;
    auVar246._0_4_ = fVar141 * auVar23._0_4_ * 3.0;
    auVar246._4_4_ = fVar141 * auVar23._4_4_ * 3.0;
    auVar246._8_4_ = fVar141 * auVar23._8_4_ * 3.0;
    auVar246._12_4_ = fVar141 * auVar23._12_4_ * 3.0;
    auVar246._16_4_ = fVar141 * auVar23._16_4_ * 3.0;
    auVar246._20_4_ = fVar141 * auVar23._20_4_ * 3.0;
    auVar246._24_4_ = fVar141 * auVar23._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar29 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar97));
    local_378 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    auVar95 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar258));
    auVar23 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar120));
    auVar25 = vsubps_avx(auVar29,auVar27);
    fVar201 = auVar95._0_4_ + auVar25._0_4_;
    fVar224 = auVar95._4_4_ + auVar25._4_4_;
    fVar225 = auVar95._8_4_ + auVar25._8_4_;
    fVar226 = auVar95._12_4_ + auVar25._12_4_;
    fVar227 = auVar95._16_4_ + auVar25._16_4_;
    fVar228 = auVar95._20_4_ + auVar25._20_4_;
    fVar229 = auVar95._24_4_ + auVar25._24_4_;
    auVar26 = vsubps_avx(local_378,auVar28);
    auVar332._0_4_ = auVar23._0_4_ + auVar26._0_4_;
    auVar332._4_4_ = auVar23._4_4_ + auVar26._4_4_;
    auVar332._8_4_ = auVar23._8_4_ + auVar26._8_4_;
    auVar332._12_4_ = auVar23._12_4_ + auVar26._12_4_;
    auVar332._16_4_ = auVar23._16_4_ + auVar26._16_4_;
    auVar332._20_4_ = auVar23._20_4_ + auVar26._20_4_;
    auVar332._24_4_ = auVar23._24_4_ + auVar26._24_4_;
    auVar332._28_4_ = auVar23._28_4_ + auVar26._28_4_;
    fVar141 = auVar120._0_4_;
    local_138 = fVar141 + (float)local_5e8._0_4_;
    fVar119 = auVar120._4_4_;
    fStack_134 = fVar119 + (float)local_5e8._4_4_;
    fVar138 = auVar120._8_4_;
    fStack_130 = fVar138 + fStack_5e0;
    fVar139 = auVar120._12_4_;
    fStack_12c = fVar139 + fStack_5dc;
    fStack_128 = fStack_5d8 + 0.0;
    fStack_124 = fStack_5d4 + 0.0;
    fStack_120 = fStack_5d0 + 0.0;
    fStack_11c = auVar24._28_4_ + 0.0;
    local_78 = ZEXT1632(auVar258);
    auVar23 = vsubps_avx(local_78,auVar30);
    local_b8 = vpermps_avx2(_DAT_0205d4a0,auVar23);
    local_98 = ZEXT1632(auVar120);
    auVar23 = vsubps_avx(local_98,_local_5e8);
    local_158 = vpermps_avx2(_DAT_0205d4a0,auVar23);
    local_d8._0_4_ = auVar97._0_4_ + fVar184;
    local_d8._4_4_ = auVar97._4_4_ + fVar199;
    local_d8._8_4_ = auVar97._8_4_ + fVar142;
    local_d8._12_4_ = auVar97._12_4_ + fVar200;
    local_d8._16_4_ = fVar181 + 0.0;
    local_d8._20_4_ = fVar182 + 0.0;
    local_d8._24_4_ = fVar183 + 0.0;
    local_d8._28_4_ = 0x40400000;
    auVar318 = ZEXT1632(auVar97);
    auVar23 = vsubps_avx(auVar318,auVar39);
    auVar30 = vpermps_avx2(_DAT_0205d4a0,auVar23);
    fVar184 = auVar98._0_4_;
    local_118._0_4_ = fVar184 + auVar246._0_4_;
    fVar199 = auVar98._4_4_;
    local_118._4_4_ = fVar199 + auVar246._4_4_;
    fVar142 = auVar98._8_4_;
    local_118._8_4_ = fVar142 + auVar246._8_4_;
    fVar200 = auVar98._12_4_;
    local_118._12_4_ = fVar200 + auVar246._12_4_;
    local_118._16_4_ = auVar246._16_4_ + 0.0;
    local_118._20_4_ = auVar246._20_4_ + 0.0;
    local_118._24_4_ = auVar246._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar23 = vsubps_avx(ZEXT1632(auVar98),auVar246);
    local_f8 = vpermps_avx2(_DAT_0205d4a0,auVar23);
    auVar40._4_4_ = fVar119 * fVar224;
    auVar40._0_4_ = fVar141 * fVar201;
    auVar40._8_4_ = fVar138 * fVar225;
    auVar40._12_4_ = fVar139 * fVar226;
    auVar40._16_4_ = fVar227 * 0.0;
    auVar40._20_4_ = fVar228 * 0.0;
    auVar40._24_4_ = fVar229 * 0.0;
    auVar40._28_4_ = auVar23._28_4_;
    auVar31 = vfnmadd231ps_fma(auVar40,local_78,auVar332);
    auVar41._4_4_ = fStack_134 * fVar224;
    auVar41._0_4_ = local_138 * fVar201;
    auVar41._8_4_ = fStack_130 * fVar225;
    auVar41._12_4_ = fStack_12c * fVar226;
    auVar41._16_4_ = fStack_128 * fVar227;
    auVar41._20_4_ = fStack_124 * fVar228;
    auVar41._24_4_ = fStack_120 * fVar229;
    auVar41._28_4_ = auVar30._28_4_;
    auVar56._4_4_ = fVar290;
    auVar56._0_4_ = fVar280;
    auVar56._8_4_ = fVar291;
    auVar56._12_4_ = fVar292;
    auVar56._16_4_ = fVar293;
    auVar56._20_4_ = fVar294;
    auVar56._24_4_ = fVar295;
    auVar56._28_4_ = 0x40400000;
    auVar93 = vfnmadd231ps_fma(auVar41,auVar332,auVar56);
    auVar42._4_4_ = local_158._4_4_ * fVar224;
    auVar42._0_4_ = local_158._0_4_ * fVar201;
    auVar42._8_4_ = local_158._8_4_ * fVar225;
    auVar42._12_4_ = local_158._12_4_ * fVar226;
    auVar42._16_4_ = local_158._16_4_ * fVar227;
    auVar42._20_4_ = local_158._20_4_ * fVar228;
    auVar42._24_4_ = local_158._24_4_ * fVar229;
    auVar42._28_4_ = fStack_11c;
    auVar83 = vfnmadd231ps_fma(auVar42,local_b8,auVar332);
    local_658._0_4_ = auVar28._0_4_;
    local_658._4_4_ = auVar28._4_4_;
    uStack_650._0_4_ = auVar28._8_4_;
    uStack_650._4_4_ = auVar28._12_4_;
    uStack_648._0_4_ = auVar28._16_4_;
    uStack_648._4_4_ = auVar28._20_4_;
    uStack_640._0_4_ = auVar28._24_4_;
    auVar43._4_4_ = fVar224 * (float)local_658._4_4_;
    auVar43._0_4_ = fVar201 * (float)local_658._0_4_;
    auVar43._8_4_ = fVar225 * (float)uStack_650;
    auVar43._12_4_ = fVar226 * uStack_650._4_4_;
    auVar43._16_4_ = fVar227 * (float)uStack_648;
    auVar43._20_4_ = fVar228 * uStack_648._4_4_;
    auVar43._24_4_ = fVar229 * (float)uStack_640;
    auVar43._28_4_ = local_158._28_4_;
    auVar81 = vfnmadd231ps_fma(auVar43,auVar27,auVar332);
    auVar62._4_4_ = fVar199 * fVar224;
    auVar62._0_4_ = fVar184 * fVar201;
    auVar62._8_4_ = fVar142 * fVar225;
    auVar62._12_4_ = fVar200 * fVar226;
    auVar62._16_4_ = fVar227 * 0.0;
    auVar62._20_4_ = fVar228 * 0.0;
    auVar62._24_4_ = fVar229 * 0.0;
    auVar62._28_4_ = DAT_0205d4a0._28_4_;
    auVar97 = vfnmadd231ps_fma(auVar62,auVar318,auVar332);
    auVar44._4_4_ = local_118._4_4_ * fVar224;
    auVar44._0_4_ = local_118._0_4_ * fVar201;
    auVar44._8_4_ = local_118._8_4_ * fVar225;
    auVar44._12_4_ = local_118._12_4_ * fVar226;
    auVar44._16_4_ = local_118._16_4_ * fVar227;
    auVar44._20_4_ = local_118._20_4_ * fVar228;
    auVar44._24_4_ = local_118._24_4_ * fVar229;
    auVar44._28_4_ = auVar27._28_4_;
    auVar104 = vfnmadd231ps_fma(auVar44,local_d8,auVar332);
    auVar45._4_4_ = local_f8._4_4_ * fVar224;
    auVar45._0_4_ = local_f8._0_4_ * fVar201;
    auVar45._8_4_ = local_f8._8_4_ * fVar225;
    auVar45._12_4_ = local_f8._12_4_ * fVar226;
    auVar45._16_4_ = local_f8._16_4_ * fVar227;
    auVar45._20_4_ = local_f8._20_4_ * fVar228;
    auVar45._24_4_ = local_f8._24_4_ * fVar229;
    auVar45._28_4_ = local_b8._28_4_;
    auVar258 = vfnmadd231ps_fma(auVar45,auVar332,auVar30);
    auVar46._4_4_ = local_378._4_4_ * fVar224;
    auVar46._0_4_ = local_378._0_4_ * fVar201;
    auVar46._8_4_ = local_378._8_4_ * fVar225;
    auVar46._12_4_ = local_378._12_4_ * fVar226;
    auVar46._16_4_ = local_378._16_4_ * fVar227;
    auVar46._20_4_ = local_378._20_4_ * fVar228;
    auVar46._24_4_ = local_378._24_4_ * fVar229;
    auVar46._28_4_ = auVar95._28_4_ + auVar25._28_4_;
    auVar120 = vfnmadd231ps_fma(auVar46,auVar332,auVar29);
    auVar23 = vminps_avx(ZEXT1632(auVar31),ZEXT1632(auVar93));
    auVar95 = vmaxps_avx(ZEXT1632(auVar31),ZEXT1632(auVar93));
    auVar24 = vminps_avx(ZEXT1632(auVar83),ZEXT1632(auVar81));
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar83),ZEXT1632(auVar81));
    auVar95 = vmaxps_avx(auVar95,auVar23);
    auVar25 = vminps_avx(ZEXT1632(auVar97),ZEXT1632(auVar104));
    auVar23 = vmaxps_avx(ZEXT1632(auVar97),ZEXT1632(auVar104));
    auVar26 = vminps_avx(ZEXT1632(auVar258),ZEXT1632(auVar120));
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(ZEXT1632(auVar258),ZEXT1632(auVar120));
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar95,auVar23);
    auVar61._4_4_ = fStack_174;
    auVar61._0_4_ = local_178;
    auVar61._8_4_ = fStack_170;
    auVar61._12_4_ = fStack_16c;
    auVar61._16_4_ = fStack_168;
    auVar61._20_4_ = fStack_164;
    auVar61._24_4_ = fStack_160;
    auVar61._28_4_ = fStack_15c;
    auVar95 = vcmpps_avx(auVar25,auVar61,2);
    auVar60._4_4_ = fStack_194;
    auVar60._0_4_ = local_198;
    auVar60._8_4_ = fStack_190;
    auVar60._12_4_ = fStack_18c;
    auVar60._16_4_ = fStack_188;
    auVar60._20_4_ = fStack_184;
    auVar60._24_4_ = fStack_180;
    auVar60._28_4_ = fStack_17c;
    auVar23 = vcmpps_avx(auVar23,auVar60,5);
    auVar95 = vandps_avx(auVar23,auVar95);
    auVar23 = local_268 & auVar95;
    uVar66 = 0;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar23 = vsubps_avx(auVar27,local_78);
      auVar24 = vsubps_avx(auVar29,auVar318);
      fVar182 = auVar23._0_4_ + auVar24._0_4_;
      fVar183 = auVar23._4_4_ + auVar24._4_4_;
      fVar201 = auVar23._8_4_ + auVar24._8_4_;
      fVar224 = auVar23._12_4_ + auVar24._12_4_;
      fVar225 = auVar23._16_4_ + auVar24._16_4_;
      fVar226 = auVar23._20_4_ + auVar24._20_4_;
      fVar227 = auVar23._24_4_ + auVar24._24_4_;
      auVar25 = vsubps_avx(auVar28,local_98);
      auVar26 = vsubps_avx(local_378,ZEXT1632(auVar98));
      auVar118._0_4_ = auVar25._0_4_ + auVar26._0_4_;
      auVar118._4_4_ = auVar25._4_4_ + auVar26._4_4_;
      auVar118._8_4_ = auVar25._8_4_ + auVar26._8_4_;
      auVar118._12_4_ = auVar25._12_4_ + auVar26._12_4_;
      auVar118._16_4_ = auVar25._16_4_ + auVar26._16_4_;
      auVar118._20_4_ = auVar25._20_4_ + auVar26._20_4_;
      auVar118._24_4_ = auVar25._24_4_ + auVar26._24_4_;
      fVar181 = auVar26._28_4_;
      auVar118._28_4_ = auVar25._28_4_ + fVar181;
      auVar342._0_4_ = fVar141 * fVar182;
      auVar342._4_4_ = fVar119 * fVar183;
      auVar342._8_4_ = fVar138 * fVar201;
      auVar342._12_4_ = fVar139 * fVar224;
      auVar342._16_4_ = fVar225 * 0.0;
      auVar342._20_4_ = fVar226 * 0.0;
      auVar342._24_4_ = fVar227 * 0.0;
      auVar342._28_4_ = 0;
      auVar97 = vfnmadd231ps_fma(auVar342,auVar118,local_78);
      auVar47._4_4_ = fVar183 * fStack_134;
      auVar47._0_4_ = fVar182 * local_138;
      auVar47._8_4_ = fVar201 * fStack_130;
      auVar47._12_4_ = fVar224 * fStack_12c;
      auVar47._16_4_ = fVar225 * fStack_128;
      auVar47._20_4_ = fVar226 * fStack_124;
      auVar47._24_4_ = fVar227 * fStack_120;
      auVar47._28_4_ = fVar181;
      auVar57._4_4_ = fVar290;
      auVar57._0_4_ = fVar280;
      auVar57._8_4_ = fVar291;
      auVar57._12_4_ = fVar292;
      auVar57._16_4_ = fVar293;
      auVar57._20_4_ = fVar294;
      auVar57._24_4_ = fVar295;
      auVar57._28_4_ = 0x40400000;
      auVar31 = vfnmadd213ps_fma(auVar57,auVar118,auVar47);
      auVar48._4_4_ = fVar183 * local_158._4_4_;
      auVar48._0_4_ = fVar182 * local_158._0_4_;
      auVar48._8_4_ = fVar201 * local_158._8_4_;
      auVar48._12_4_ = fVar224 * local_158._12_4_;
      auVar48._16_4_ = fVar225 * local_158._16_4_;
      auVar48._20_4_ = fVar226 * local_158._20_4_;
      auVar48._24_4_ = fVar227 * local_158._24_4_;
      auVar48._28_4_ = fVar181;
      auVar93 = vfnmadd213ps_fma(local_b8,auVar118,auVar48);
      auVar49._4_4_ = (float)local_658._4_4_ * fVar183;
      auVar49._0_4_ = (float)local_658._0_4_ * fVar182;
      auVar49._8_4_ = (float)uStack_650 * fVar201;
      auVar49._12_4_ = uStack_650._4_4_ * fVar224;
      auVar49._16_4_ = (float)uStack_648 * fVar225;
      auVar49._20_4_ = uStack_648._4_4_ * fVar226;
      auVar49._24_4_ = (float)uStack_640 * fVar227;
      auVar49._28_4_ = fVar181;
      auVar98 = vfnmadd231ps_fma(auVar49,auVar118,auVar27);
      auVar136._0_4_ = fVar184 * fVar182;
      auVar136._4_4_ = fVar199 * fVar183;
      auVar136._8_4_ = fVar142 * fVar201;
      auVar136._12_4_ = fVar200 * fVar224;
      auVar136._16_4_ = fVar225 * 0.0;
      auVar136._20_4_ = fVar226 * 0.0;
      auVar136._24_4_ = fVar227 * 0.0;
      auVar136._28_4_ = 0;
      auVar104 = vfnmadd231ps_fma(auVar136,auVar118,auVar318);
      auVar50._4_4_ = fVar183 * local_118._4_4_;
      auVar50._0_4_ = fVar182 * local_118._0_4_;
      auVar50._8_4_ = fVar201 * local_118._8_4_;
      auVar50._12_4_ = fVar224 * local_118._12_4_;
      auVar50._16_4_ = fVar225 * local_118._16_4_;
      auVar50._20_4_ = fVar226 * local_118._20_4_;
      auVar50._24_4_ = fVar227 * local_118._24_4_;
      auVar50._28_4_ = auVar28._28_4_;
      auVar83 = vfnmadd213ps_fma(local_d8,auVar118,auVar50);
      auVar51._4_4_ = fVar183 * local_f8._4_4_;
      auVar51._0_4_ = fVar182 * local_f8._0_4_;
      auVar51._8_4_ = fVar201 * local_f8._8_4_;
      auVar51._12_4_ = fVar224 * local_f8._12_4_;
      auVar51._16_4_ = fVar225 * local_f8._16_4_;
      auVar51._20_4_ = fVar226 * local_f8._20_4_;
      auVar51._24_4_ = fVar227 * local_f8._24_4_;
      auVar51._28_4_ = auVar28._28_4_;
      auVar81 = vfnmadd213ps_fma(auVar30,auVar118,auVar51);
      auVar52._4_4_ = local_378._4_4_ * fVar183;
      auVar52._0_4_ = local_378._0_4_ * fVar182;
      auVar52._8_4_ = local_378._8_4_ * fVar201;
      auVar52._12_4_ = local_378._12_4_ * fVar224;
      auVar52._16_4_ = local_378._16_4_ * fVar225;
      auVar52._20_4_ = local_378._20_4_ * fVar226;
      auVar52._24_4_ = local_378._24_4_ * fVar227;
      auVar52._28_4_ = auVar23._28_4_ + auVar24._28_4_;
      auVar258 = vfnmadd231ps_fma(auVar52,auVar118,auVar29);
      auVar24 = vminps_avx(ZEXT1632(auVar97),ZEXT1632(auVar31));
      auVar23 = vmaxps_avx(ZEXT1632(auVar97),ZEXT1632(auVar31));
      auVar25 = vminps_avx(ZEXT1632(auVar93),ZEXT1632(auVar98));
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar93),ZEXT1632(auVar98));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar26 = vminps_avx(ZEXT1632(auVar104),ZEXT1632(auVar83));
      auVar24 = vmaxps_avx(ZEXT1632(auVar104),ZEXT1632(auVar83));
      auVar27 = vminps_avx(ZEXT1632(auVar81),ZEXT1632(auVar258));
      auVar26 = vminps_avx(auVar26,auVar27);
      auVar26 = vminps_avx(auVar25,auVar26);
      auVar25 = vmaxps_avx(ZEXT1632(auVar81),ZEXT1632(auVar258));
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vcmpps_avx(auVar26,auVar61,2);
      auVar24 = vcmpps_avx(auVar24,auVar60,5);
      auVar23 = vandps_avx(auVar24,auVar23);
      auVar95 = vandps_avx(auVar95,local_268);
      auVar24 = auVar95 & auVar23;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0x7f,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0xbf,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar24[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar23,auVar95);
        uVar66 = vmovmskps_avx(auVar95);
      }
    }
    if (uVar66 != 0) {
      auStack_3b8[uVar70] = uVar66;
      uVar202 = vmovlps_avx(local_2e8);
      *(undefined8 *)(&uStack_248 + uVar70 * 2) = uVar202;
      uVar75 = vmovlps_avx(local_668);
      auStack_58[uVar70] = uVar75;
      uVar70 = (ulong)((int)uVar70 + 1);
    }
    do {
      if ((int)uVar70 == 0) {
        if ((uVar76 & 1) != 0) {
          return local_669;
        }
        uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar94._4_4_ = uVar80;
        auVar94._0_4_ = uVar80;
        auVar94._8_4_ = uVar80;
        auVar94._12_4_ = uVar80;
        auVar14 = vcmpps_avx(local_2f8,auVar94,2);
        uVar69 = vmovmskps_avx(auVar14);
        uVar65 = uVar65 & uVar65 + 0xf & uVar69;
        local_669 = uVar65 != 0;
        if (!local_669) {
          return local_669;
        }
        goto LAB_0178f00a;
      }
      uVar67 = (int)uVar70 - 1;
      uVar71 = (ulong)uVar67;
      uVar74 = auStack_3b8[uVar71];
      uVar66 = (&uStack_248)[uVar71 * 2];
      fVar184 = afStack_244[uVar71 * 2];
      iVar68 = 0;
      for (uVar75 = (ulong)uVar74; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        iVar68 = iVar68 + 1;
      }
      uVar74 = uVar74 - 1 & uVar74;
      if (uVar74 == 0) {
        uVar70 = (ulong)uVar67;
      }
      local_668._8_8_ = 0;
      local_668._0_8_ = auStack_58[uVar71];
      auStack_3b8[uVar71] = uVar74;
      fVar199 = (float)(iVar68 + 1) * 0.14285715;
      auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * (float)iVar68 * 0.14285715)),
                                ZEXT416(uVar66),ZEXT416((uint)(1.0 - (float)iVar68 * 0.14285715)));
      auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * fVar199)),ZEXT416(uVar66),
                                ZEXT416((uint)(1.0 - fVar199)));
      auVar223._0_4_ = auVar31._0_4_;
      fVar199 = auVar93._0_4_;
      fVar184 = fVar199 - auVar223._0_4_;
      if (0.16666667 <= fVar184) break;
      auVar83 = vshufps_avx(local_668,local_668,0x50);
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = &DAT_3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar81 = vsubps_avx(auVar126,auVar83);
      fVar142 = auVar83._0_4_;
      auVar150._0_4_ = fVar142 * fVar140;
      fVar200 = auVar83._4_4_;
      auVar150._4_4_ = fVar200 * fVar159;
      fVar141 = auVar83._8_4_;
      auVar150._8_4_ = fVar141 * fVar140;
      fVar119 = auVar83._12_4_;
      auVar150._12_4_ = fVar119 * fVar159;
      auVar169._0_4_ = fVar142 * fVar230;
      auVar169._4_4_ = fVar200 * fVar247;
      auVar169._8_4_ = fVar141 * fVar230;
      auVar169._12_4_ = fVar119 * fVar247;
      auVar192._0_4_ = fVar142 * fVar269;
      auVar192._4_4_ = fVar200 * fVar279;
      auVar192._8_4_ = fVar141 * fVar269;
      auVar192._12_4_ = fVar119 * fVar279;
      auVar110._0_4_ = fVar142 * fVar333;
      auVar110._4_4_ = fVar200 * fVar343;
      auVar110._8_4_ = fVar141 * fVar333;
      auVar110._12_4_ = fVar119 * fVar343;
      auVar83 = vfmadd231ps_fma(auVar150,auVar81,auVar217);
      auVar97 = vfmadd231ps_fma(auVar169,auVar81,auVar255);
      auVar98 = vfmadd231ps_fma(auVar192,auVar81,auVar283);
      auVar81 = vfmadd231ps_fma(auVar110,auVar81,auVar324);
      auVar137._16_16_ = auVar83;
      auVar137._0_16_ = auVar83;
      auVar157._16_16_ = auVar97;
      auVar157._0_16_ = auVar97;
      auVar180._16_16_ = auVar98;
      auVar180._0_16_ = auVar98;
      auVar223._4_4_ = auVar223._0_4_;
      auVar223._8_4_ = auVar223._0_4_;
      auVar223._12_4_ = auVar223._0_4_;
      auVar223._20_4_ = fVar199;
      auVar223._16_4_ = fVar199;
      auVar223._24_4_ = fVar199;
      auVar223._28_4_ = fVar199;
      auVar95 = vsubps_avx(auVar157,auVar137);
      auVar97 = vfmadd213ps_fma(auVar95,auVar223,auVar137);
      auVar95 = vsubps_avx(auVar180,auVar157);
      auVar104 = vfmadd213ps_fma(auVar95,auVar223,auVar157);
      auVar83 = vsubps_avx(auVar81,auVar98);
      auVar158._16_16_ = auVar83;
      auVar158._0_16_ = auVar83;
      auVar83 = vfmadd213ps_fma(auVar158,auVar223,auVar180);
      auVar95 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar97));
      auVar81 = vfmadd213ps_fma(auVar95,auVar223,ZEXT1632(auVar97));
      auVar95 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar104));
      auVar83 = vfmadd213ps_fma(auVar95,auVar223,ZEXT1632(auVar104));
      auVar95 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar81));
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar95,auVar223);
      fVar139 = auVar95._4_4_ * 3.0;
      fVar138 = fVar184 * 0.33333334;
      auVar284._0_8_ =
           CONCAT44(auVar121._4_4_ + fVar138 * fVar139,
                    auVar121._0_4_ + fVar138 * auVar95._0_4_ * 3.0);
      auVar284._8_4_ = auVar121._8_4_ + fVar138 * auVar95._8_4_ * 3.0;
      auVar284._12_4_ = auVar121._12_4_ + fVar138 * auVar95._12_4_ * 3.0;
      auVar81 = vshufpd_avx(auVar121,auVar121,3);
      auVar97 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar83 = vsubps_avx(auVar81,auVar121);
      auVar98 = vsubps_avx(auVar97,(undefined1  [16])0x0);
      auVar127._0_4_ = auVar83._0_4_ + auVar98._0_4_;
      auVar127._4_4_ = auVar83._4_4_ + auVar98._4_4_;
      auVar127._8_4_ = auVar83._8_4_ + auVar98._8_4_;
      auVar127._12_4_ = auVar83._12_4_ + auVar98._12_4_;
      auVar83 = vshufps_avx(auVar121,auVar121,0xb1);
      auVar98 = vshufps_avx(auVar284,auVar284,0xb1);
      auVar325._4_4_ = auVar127._0_4_;
      auVar325._0_4_ = auVar127._0_4_;
      auVar325._8_4_ = auVar127._0_4_;
      auVar325._12_4_ = auVar127._0_4_;
      auVar104 = vshufps_avx(auVar127,auVar127,0x55);
      fVar142 = auVar104._0_4_;
      auVar239._0_4_ = auVar83._0_4_ * fVar142;
      fVar200 = auVar104._4_4_;
      auVar239._4_4_ = auVar83._4_4_ * fVar200;
      fVar141 = auVar104._8_4_;
      auVar239._8_4_ = auVar83._8_4_ * fVar141;
      fVar119 = auVar104._12_4_;
      auVar239._12_4_ = auVar83._12_4_ * fVar119;
      auVar256._0_4_ = auVar98._0_4_ * fVar142;
      auVar256._4_4_ = auVar98._4_4_ * fVar200;
      auVar256._8_4_ = auVar98._8_4_ * fVar141;
      auVar256._12_4_ = auVar98._12_4_ * fVar119;
      auVar258 = vfmadd231ps_fma(auVar239,auVar325,auVar121);
      auVar120 = vfmadd231ps_fma(auVar256,auVar325,auVar284);
      auVar98 = vshufps_avx(auVar258,auVar258,0xe8);
      auVar104 = vshufps_avx(auVar120,auVar120,0xe8);
      auVar83 = vcmpps_avx(auVar98,auVar104,1);
      uVar66 = vextractps_avx(auVar83,0);
      auVar160 = auVar120;
      if ((uVar66 & 1) == 0) {
        auVar160 = auVar258;
      }
      auVar170._0_4_ = fVar138 * auVar95._16_4_ * 3.0;
      auVar170._4_4_ = fVar138 * fVar139;
      auVar170._8_4_ = fVar138 * auVar95._24_4_ * 3.0;
      auVar170._12_4_ = fVar138 * fVar199;
      auVar205 = vsubps_avx((undefined1  [16])0x0,auVar170);
      auVar171 = vshufps_avx(auVar205,auVar205,0xb1);
      auVar203 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar345._0_4_ = auVar171._0_4_ * fVar142;
      auVar345._4_4_ = auVar171._4_4_ * fVar200;
      auVar345._8_4_ = auVar171._8_4_ * fVar141;
      auVar345._12_4_ = auVar171._12_4_ * fVar119;
      auVar128._0_4_ = auVar203._0_4_ * fVar142;
      auVar128._4_4_ = auVar203._4_4_ * fVar200;
      auVar128._8_4_ = auVar203._8_4_ * fVar141;
      auVar128._12_4_ = auVar203._12_4_ * fVar119;
      auVar231 = vfmadd231ps_fma(auVar345,auVar325,auVar205);
      auVar248 = vfmadd231ps_fma(auVar128,(undefined1  [16])0x0,auVar325);
      auVar203 = vshufps_avx(auVar231,auVar231,0xe8);
      auVar204 = vshufps_avx(auVar248,auVar248,0xe8);
      auVar171 = vcmpps_avx(auVar203,auVar204,1);
      uVar66 = vextractps_avx(auVar171,0);
      auVar249 = auVar248;
      if ((uVar66 & 1) == 0) {
        auVar249 = auVar231;
      }
      auVar160 = vmaxss_avx(auVar249,auVar160);
      auVar98 = vminps_avx(auVar98,auVar104);
      auVar104 = vminps_avx(auVar203,auVar204);
      auVar104 = vminps_avx(auVar98,auVar104);
      auVar83 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vblendps_avx(auVar83,auVar171,2);
      auVar171 = vpslld_avx(auVar83,0x1f);
      auVar83 = vshufpd_avx(auVar120,auVar120,1);
      auVar83 = vinsertps_avx(auVar83,auVar248,0x9c);
      auVar98 = vshufpd_avx(auVar258,auVar258,1);
      auVar98 = vinsertps_avx(auVar98,auVar231,0x9c);
      auVar83 = vblendvps_avx(auVar98,auVar83,auVar171);
      auVar98 = vmovshdup_avx(auVar83);
      auVar83 = vmaxss_avx(auVar98,auVar83);
      fVar141 = auVar104._0_4_;
      auVar98 = vmovshdup_avx(auVar104);
      fVar200 = auVar83._0_4_;
      fVar142 = auVar160._0_4_;
      if ((0.0001 <= fVar141) || (fVar200 <= -0.0001)) {
        auVar258 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar120 = vcmpps_avx(auVar104,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar258 = vorps_avx(auVar120,auVar258);
        if ((-0.0001 < fVar142 & auVar258[0]) != 0) goto LAB_017905ce;
        auVar258 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar83,5);
        auVar120 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar258 = vorps_avx(auVar120,auVar258);
        if ((auVar258 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_017905ce;
LAB_017910f7:
        bVar53 = true;
      }
      else {
LAB_017905ce:
        auVar120 = vcmpps_avx(auVar104,_DAT_01feba10,1);
        auVar171 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar258 = vcmpss_avx(auVar160,ZEXT816(0) << 0x20,1);
        auVar193._8_4_ = 0x3f800000;
        auVar193._0_8_ = &DAT_3f8000003f800000;
        auVar193._12_4_ = 0x3f800000;
        auVar257._8_4_ = 0xbf800000;
        auVar257._0_8_ = 0xbf800000bf800000;
        auVar257._12_4_ = 0xbf800000;
        auVar258 = vblendvps_avx(auVar193,auVar257,auVar258);
        auVar120 = vblendvps_avx(auVar193,auVar257,auVar120);
        fVar119 = auVar120._0_4_;
        fVar138 = auVar258._0_4_;
        auVar258 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar119 == fVar138) && (!NAN(fVar119) && !NAN(fVar138))) {
          auVar258 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar119 == fVar138) && (!NAN(fVar119) && !NAN(fVar138))) {
          auVar171 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar120 = vmovshdup_avx(auVar120);
        fVar139 = auVar120._0_4_;
        auVar120 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar119 != fVar139) || (NAN(fVar119) || NAN(fVar139))) {
          fVar119 = auVar98._0_4_;
          if ((fVar119 != fVar141) || (NAN(fVar119) || NAN(fVar141))) {
            auVar129._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
            auVar129._8_4_ = auVar104._8_4_ ^ 0x80000000;
            auVar129._12_4_ = auVar104._12_4_ ^ 0x80000000;
            auVar172._0_4_ = -fVar141 / (fVar119 - fVar141);
            auVar172._4_12_ = auVar129._4_12_;
            auVar54._12_4_ = 0;
            auVar54._0_12_ = ZEXT812(0);
            auVar194._12_4_ = 0;
            auVar194._0_12_ = ZEXT812(0);
            auVar194 = auVar194 << 0x20;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar172._0_4_)),auVar54 << 0x20,auVar172
                                     );
            auVar104 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar141 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar141))) {
              auVar98 = ZEXT816(0);
            }
            auVar194 = ZEXT816(0) << 0x20;
            auVar104 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar141 == 0.0) && (auVar104 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar141))) {
              auVar104 = auVar120;
            }
          }
          auVar258 = vminss_avx(auVar258,auVar98);
          auVar171 = vmaxss_avx(auVar104,auVar171);
        }
        else {
          auVar194 = ZEXT816(0) << 0x20;
        }
        auVar83 = vcmpss_avx(auVar83,auVar194,1);
        auVar173._8_4_ = 0x3f800000;
        auVar173._0_8_ = &DAT_3f8000003f800000;
        auVar173._12_4_ = 0x3f800000;
        auVar310._8_4_ = 0xbf800000;
        auVar310._0_8_ = 0xbf800000bf800000;
        auVar310._12_4_ = 0xbf800000;
        auVar83 = vblendvps_avx(auVar173,auVar310,auVar83);
        fVar141 = auVar83._0_4_;
        if ((fVar138 != fVar141) || (NAN(fVar138) || NAN(fVar141))) {
          if ((fVar200 != fVar142) || (NAN(fVar200) || NAN(fVar142))) {
            auVar130._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
            auVar130._8_4_ = auVar160._8_4_ ^ 0x80000000;
            auVar130._12_4_ = auVar160._12_4_ ^ 0x80000000;
            auVar174._0_4_ = -fVar142 / (fVar200 - fVar142);
            auVar174._4_12_ = auVar130._4_12_;
            auVar83 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar174._0_4_)),auVar194,auVar174);
            auVar98 = auVar83;
          }
          else {
            auVar83 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar142 == 0.0) && (auVar83 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar142))) {
              auVar83 = ZEXT816(0);
            }
            auVar98 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar142 == 0.0) && (auVar98 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar142))) {
              auVar98 = auVar120;
            }
          }
          auVar258 = vminss_avx(auVar258,auVar83);
          auVar171 = vmaxss_avx(auVar98,auVar171);
        }
        if ((fVar139 != fVar141) || (NAN(fVar139) || NAN(fVar141))) {
          auVar258 = vminss_avx(auVar258,auVar120);
          auVar171 = vmaxss_avx(auVar120,auVar171);
        }
        auVar83 = vmaxss_avx(auVar194,auVar258);
        auVar98 = vminss_avx(auVar171,auVar120);
        bVar53 = true;
        if (auVar83._0_4_ <= auVar98._0_4_) {
          auVar83 = vmaxss_avx(auVar194,ZEXT416((uint)(auVar83._0_4_ + -0.1)));
          auVar98 = vminss_avx(ZEXT416((uint)(auVar98._0_4_ + 0.1)),auVar120);
          auVar111._0_8_ = auVar121._0_8_;
          auVar111._8_8_ = auVar111._0_8_;
          auVar259._8_8_ = auVar284._0_8_;
          auVar259._0_8_ = auVar284._0_8_;
          auVar274._8_8_ = auVar205._0_8_;
          auVar274._0_8_ = auVar205._0_8_;
          auVar104 = vshufpd_avx(auVar284,auVar284,3);
          auVar258 = vshufpd_avx(auVar205,auVar205,3);
          auVar120 = vshufps_avx(auVar83,auVar98,0);
          auVar151._8_4_ = 0x3f800000;
          auVar151._0_8_ = &DAT_3f8000003f800000;
          auVar151._12_4_ = 0x3f800000;
          auVar121 = vsubps_avx(auVar151,auVar120);
          local_5e8._0_4_ = auVar81._0_4_;
          local_5e8._4_4_ = auVar81._4_4_;
          fStack_5e0 = auVar81._8_4_;
          fStack_5dc = auVar81._12_4_;
          fVar142 = auVar120._0_4_;
          auVar152._0_4_ = fVar142 * (float)local_5e8._0_4_;
          fVar200 = auVar120._4_4_;
          auVar152._4_4_ = fVar200 * (float)local_5e8._4_4_;
          fVar141 = auVar120._8_4_;
          auVar152._8_4_ = fVar141 * fStack_5e0;
          fVar119 = auVar120._12_4_;
          auVar152._12_4_ = fVar119 * fStack_5dc;
          auVar175._0_4_ = auVar104._0_4_ * fVar142;
          auVar175._4_4_ = auVar104._4_4_ * fVar200;
          auVar175._8_4_ = auVar104._8_4_ * fVar141;
          auVar175._12_4_ = auVar104._12_4_ * fVar119;
          auVar195._0_4_ = auVar258._0_4_ * fVar142;
          auVar195._4_4_ = auVar258._4_4_ * fVar200;
          auVar195._8_4_ = auVar258._8_4_ * fVar141;
          auVar195._12_4_ = auVar258._12_4_ * fVar119;
          local_658._0_4_ = auVar97._0_4_;
          local_658._4_4_ = auVar97._4_4_;
          uStack_650._0_4_ = auVar97._8_4_;
          uStack_650._4_4_ = auVar97._12_4_;
          auVar218._0_4_ = fVar142 * (float)local_658._0_4_;
          auVar218._4_4_ = fVar200 * (float)local_658._4_4_;
          auVar218._8_4_ = fVar141 * (float)uStack_650;
          auVar218._12_4_ = fVar119 * uStack_650._4_4_;
          auVar104 = vfmadd231ps_fma(auVar152,auVar121,auVar111);
          auVar258 = vfmadd231ps_fma(auVar175,auVar121,auVar259);
          auVar120 = vfmadd231ps_fma(auVar195,auVar121,auVar274);
          auVar121 = vfmadd231ps_fma(auVar218,auVar121,ZEXT816(0));
          auVar81 = vmovshdup_avx(local_668);
          auVar203 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar83._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar83._0_4_)));
          auVar204 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar98._0_4_)),local_668,
                                     ZEXT416((uint)(1.0 - auVar98._0_4_)));
          fVar142 = 1.0 / fVar184;
          auVar83 = vsubps_avx(auVar258,auVar104);
          auVar240._0_4_ = auVar83._0_4_ * 3.0;
          auVar240._4_4_ = auVar83._4_4_ * 3.0;
          auVar240._8_4_ = auVar83._8_4_ * 3.0;
          auVar240._12_4_ = auVar83._12_4_ * 3.0;
          auVar83 = vsubps_avx(auVar120,auVar258);
          auVar260._0_4_ = auVar83._0_4_ * 3.0;
          auVar260._4_4_ = auVar83._4_4_ * 3.0;
          auVar260._8_4_ = auVar83._8_4_ * 3.0;
          auVar260._12_4_ = auVar83._12_4_ * 3.0;
          auVar83 = vsubps_avx(auVar121,auVar120);
          auVar275._0_4_ = auVar83._0_4_ * 3.0;
          auVar275._4_4_ = auVar83._4_4_ * 3.0;
          auVar275._8_4_ = auVar83._8_4_ * 3.0;
          auVar275._12_4_ = auVar83._12_4_ * 3.0;
          auVar81 = vminps_avx(auVar260,auVar275);
          auVar83 = vmaxps_avx(auVar260,auVar275);
          auVar81 = vminps_avx(auVar240,auVar81);
          auVar83 = vmaxps_avx(auVar240,auVar83);
          auVar97 = vshufpd_avx(auVar81,auVar81,3);
          auVar98 = vshufpd_avx(auVar83,auVar83,3);
          auVar81 = vminps_avx(auVar81,auVar97);
          auVar83 = vmaxps_avx(auVar83,auVar98);
          auVar261._0_4_ = auVar81._0_4_ * fVar142;
          auVar261._4_4_ = auVar81._4_4_ * fVar142;
          auVar261._8_4_ = auVar81._8_4_ * fVar142;
          auVar261._12_4_ = auVar81._12_4_ * fVar142;
          auVar241._0_4_ = fVar142 * auVar83._0_4_;
          auVar241._4_4_ = fVar142 * auVar83._4_4_;
          auVar241._8_4_ = fVar142 * auVar83._8_4_;
          auVar241._12_4_ = fVar142 * auVar83._12_4_;
          fVar142 = 1.0 / (auVar204._0_4_ - auVar203._0_4_);
          auVar83 = vshufpd_avx(auVar104,auVar104,3);
          auVar81 = vshufpd_avx(auVar258,auVar258,3);
          auVar97 = vshufpd_avx(auVar120,auVar120,3);
          auVar98 = vshufpd_avx(auVar121,auVar121,3);
          auVar83 = vsubps_avx(auVar83,auVar104);
          auVar104 = vsubps_avx(auVar81,auVar258);
          auVar258 = vsubps_avx(auVar97,auVar120);
          auVar98 = vsubps_avx(auVar98,auVar121);
          auVar81 = vminps_avx(auVar83,auVar104);
          auVar83 = vmaxps_avx(auVar83,auVar104);
          auVar97 = vminps_avx(auVar258,auVar98);
          auVar97 = vminps_avx(auVar81,auVar97);
          auVar81 = vmaxps_avx(auVar258,auVar98);
          auVar83 = vmaxps_avx(auVar83,auVar81);
          auVar301._0_4_ = fVar142 * auVar97._0_4_;
          auVar301._4_4_ = fVar142 * auVar97._4_4_;
          auVar301._8_4_ = fVar142 * auVar97._8_4_;
          auVar301._12_4_ = fVar142 * auVar97._12_4_;
          auVar285._0_4_ = fVar142 * auVar83._0_4_;
          auVar285._4_4_ = fVar142 * auVar83._4_4_;
          auVar285._8_4_ = fVar142 * auVar83._8_4_;
          auVar285._12_4_ = fVar142 * auVar83._12_4_;
          auVar98 = vinsertps_avx(auVar31,auVar203,0x10);
          auVar104 = vinsertps_avx(auVar93,auVar204,0x10);
          auVar92._0_4_ = (auVar98._0_4_ + auVar104._0_4_) * 0.5;
          auVar92._4_4_ = (auVar98._4_4_ + auVar104._4_4_) * 0.5;
          auVar92._8_4_ = (auVar98._8_4_ + auVar104._8_4_) * 0.5;
          auVar92._12_4_ = (auVar98._12_4_ + auVar104._12_4_) * 0.5;
          auVar153._4_4_ = auVar92._0_4_;
          auVar153._0_4_ = auVar92._0_4_;
          auVar153._8_4_ = auVar92._0_4_;
          auVar153._12_4_ = auVar92._0_4_;
          auVar83 = vfmadd213ps_fma(auVar14,auVar153,auVar17);
          auVar81 = vfmadd213ps_fma(auVar15,auVar153,auVar18);
          auVar97 = vfmadd213ps_fma(auVar16,auVar153,auVar164);
          auVar93 = vsubps_avx(auVar81,auVar83);
          auVar83 = vfmadd213ps_fma(auVar93,auVar153,auVar83);
          auVar93 = vsubps_avx(auVar97,auVar81);
          auVar93 = vfmadd213ps_fma(auVar93,auVar153,auVar81);
          auVar93 = vsubps_avx(auVar93,auVar83);
          auVar83 = vfmadd231ps_fma(auVar83,auVar93,auVar153);
          auVar154._0_8_ = CONCAT44(auVar93._4_4_ * 3.0,auVar93._0_4_ * 3.0);
          auVar154._8_4_ = auVar93._8_4_ * 3.0;
          auVar154._12_4_ = auVar93._12_4_ * 3.0;
          auVar276._8_8_ = auVar83._0_8_;
          auVar276._0_8_ = auVar83._0_8_;
          auVar93 = vshufpd_avx(auVar83,auVar83,3);
          auVar83 = vshufps_avx(auVar92,auVar92,0x55);
          auVar258 = vsubps_avx(auVar93,auVar276);
          auVar121 = vfmadd231ps_fma(auVar276,auVar83,auVar258);
          auVar326._8_8_ = auVar154._0_8_;
          auVar326._0_8_ = auVar154._0_8_;
          auVar93 = vshufpd_avx(auVar154,auVar154,3);
          auVar93 = vsubps_avx(auVar93,auVar326);
          auVar120 = vfmadd213ps_fma(auVar93,auVar83,auVar326);
          auVar83 = vmovshdup_avx(auVar120);
          auVar327._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
          auVar327._8_4_ = auVar83._8_4_ ^ 0x80000000;
          auVar327._12_4_ = auVar83._12_4_ ^ 0x80000000;
          auVar81 = vmovshdup_avx(auVar258);
          auVar93 = vunpcklps_avx(auVar81,auVar327);
          auVar97 = vshufps_avx(auVar93,auVar327,4);
          auVar346._0_8_ = auVar258._0_8_ ^ 0x8000000080000000;
          auVar346._8_4_ = auVar258._8_4_ ^ 0x80000000;
          auVar346._12_4_ = auVar258._12_4_ ^ 0x80000000;
          auVar93 = vmovlhps_avx(auVar346,auVar120);
          auVar93 = vshufps_avx(auVar93,auVar120,8);
          auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar258._0_4_)),auVar81,auVar120
                                   );
          auVar176._0_4_ = auVar83._0_4_;
          auVar176._4_4_ = auVar176._0_4_;
          auVar176._8_4_ = auVar176._0_4_;
          auVar176._12_4_ = auVar176._0_4_;
          auVar83 = vdivps_avx(auVar97,auVar176);
          auVar81 = vdivps_avx(auVar93,auVar176);
          fVar141 = auVar121._0_4_;
          fVar142 = auVar83._0_4_;
          auVar93 = vshufps_avx(auVar121,auVar121,0x55);
          fVar200 = auVar81._0_4_;
          local_658._4_4_ = fVar141 * auVar83._4_4_ + auVar93._4_4_ * auVar81._4_4_;
          local_658._0_4_ = fVar141 * fVar142 + auVar93._0_4_ * fVar200;
          uStack_650._0_4_ = fVar141 * auVar83._8_4_ + auVar93._8_4_ * auVar81._8_4_;
          uStack_650._4_4_ = fVar141 * auVar83._12_4_ + auVar93._12_4_ * auVar81._12_4_;
          auVar258 = vmovshdup_avx(auVar83);
          auVar93 = vinsertps_avx(auVar261,auVar301,0x1c);
          auVar339._0_4_ = auVar258._0_4_ * auVar93._0_4_;
          auVar339._4_4_ = auVar258._4_4_ * auVar93._4_4_;
          auVar339._8_4_ = auVar258._8_4_ * auVar93._8_4_;
          auVar339._12_4_ = auVar258._12_4_ * auVar93._12_4_;
          auVar97 = vinsertps_avx(auVar241,auVar285,0x1c);
          auVar311._0_4_ = auVar258._0_4_ * auVar97._0_4_;
          auVar311._4_4_ = auVar258._4_4_ * auVar97._4_4_;
          auVar311._8_4_ = auVar258._8_4_ * auVar97._8_4_;
          auVar311._12_4_ = auVar258._12_4_ * auVar97._12_4_;
          auVar160 = vminps_avx(auVar339,auVar311);
          auVar121 = vmaxps_avx(auVar311,auVar339);
          auVar258 = vinsertps_avx(auVar301,auVar261,0x4c);
          auVar171 = vmovshdup_avx(auVar81);
          auVar120 = vinsertps_avx(auVar285,auVar241,0x4c);
          auVar286._0_4_ = auVar171._0_4_ * auVar258._0_4_;
          auVar286._4_4_ = auVar171._4_4_ * auVar258._4_4_;
          auVar286._8_4_ = auVar171._8_4_ * auVar258._8_4_;
          auVar286._12_4_ = auVar171._12_4_ * auVar258._12_4_;
          auVar302._0_4_ = auVar171._0_4_ * auVar120._0_4_;
          auVar302._4_4_ = auVar171._4_4_ * auVar120._4_4_;
          auVar302._8_4_ = auVar171._8_4_ * auVar120._8_4_;
          auVar302._12_4_ = auVar171._12_4_ * auVar120._12_4_;
          auVar171 = vminps_avx(auVar286,auVar302);
          auVar112._0_4_ = auVar171._0_4_ + auVar160._0_4_;
          auVar112._4_4_ = auVar171._4_4_ + auVar160._4_4_;
          auVar112._8_4_ = auVar171._8_4_ + auVar160._8_4_;
          auVar112._12_4_ = auVar171._12_4_ + auVar160._12_4_;
          auVar160 = vmaxps_avx(auVar302,auVar286);
          auVar287._0_4_ = auVar121._0_4_ + auVar160._0_4_;
          auVar287._4_4_ = auVar121._4_4_ + auVar160._4_4_;
          auVar287._8_4_ = auVar121._8_4_ + auVar160._8_4_;
          auVar287._12_4_ = auVar121._12_4_ + auVar160._12_4_;
          auVar303._8_8_ = 0x3f80000000000000;
          auVar303._0_8_ = 0x3f80000000000000;
          auVar121 = vsubps_avx(auVar303,auVar287);
          auVar160 = vsubps_avx(auVar303,auVar112);
          auVar171 = vsubps_avx(auVar98,auVar92);
          auVar328._0_4_ = fVar142 * auVar93._0_4_;
          auVar328._4_4_ = fVar142 * auVar93._4_4_;
          auVar328._8_4_ = fVar142 * auVar93._8_4_;
          auVar328._12_4_ = fVar142 * auVar93._12_4_;
          auVar312._0_4_ = fVar142 * auVar97._0_4_;
          auVar312._4_4_ = fVar142 * auVar97._4_4_;
          auVar312._8_4_ = fVar142 * auVar97._8_4_;
          auVar312._12_4_ = fVar142 * auVar97._12_4_;
          auVar97 = vminps_avx(auVar328,auVar312);
          auVar93 = vmaxps_avx(auVar312,auVar328);
          auVar262._0_4_ = fVar200 * auVar258._0_4_;
          auVar262._4_4_ = fVar200 * auVar258._4_4_;
          auVar262._8_4_ = fVar200 * auVar258._8_4_;
          auVar262._12_4_ = fVar200 * auVar258._12_4_;
          auVar242._0_4_ = fVar200 * auVar120._0_4_;
          auVar242._4_4_ = fVar200 * auVar120._4_4_;
          auVar242._8_4_ = fVar200 * auVar120._8_4_;
          auVar242._12_4_ = fVar200 * auVar120._12_4_;
          auVar258 = vminps_avx(auVar262,auVar242);
          auVar329._0_4_ = auVar97._0_4_ + auVar258._0_4_;
          auVar329._4_4_ = auVar97._4_4_ + auVar258._4_4_;
          auVar329._8_4_ = auVar97._8_4_ + auVar258._8_4_;
          auVar329._12_4_ = auVar97._12_4_ + auVar258._12_4_;
          auVar258 = vsubps_avx(auVar104,auVar92);
          auVar97 = vmaxps_avx(auVar242,auVar262);
          fVar141 = auVar171._0_4_;
          auVar263._0_4_ = fVar141 * auVar121._0_4_;
          fVar119 = auVar171._4_4_;
          auVar263._4_4_ = fVar119 * auVar121._4_4_;
          fVar138 = auVar171._8_4_;
          auVar263._8_4_ = fVar138 * auVar121._8_4_;
          fVar139 = auVar171._12_4_;
          auVar263._12_4_ = fVar139 * auVar121._12_4_;
          auVar243._0_4_ = auVar93._0_4_ + auVar97._0_4_;
          auVar243._4_4_ = auVar93._4_4_ + auVar97._4_4_;
          auVar243._8_4_ = auVar93._8_4_ + auVar97._8_4_;
          auVar243._12_4_ = auVar93._12_4_ + auVar97._12_4_;
          auVar313._8_8_ = 0x3f800000;
          auVar313._0_8_ = 0x3f800000;
          auVar93 = vsubps_avx(auVar313,auVar243);
          auVar97 = vsubps_avx(auVar313,auVar329);
          auVar330._0_4_ = fVar141 * auVar160._0_4_;
          auVar330._4_4_ = fVar119 * auVar160._4_4_;
          auVar330._8_4_ = fVar138 * auVar160._8_4_;
          auVar330._12_4_ = fVar139 * auVar160._12_4_;
          fVar181 = auVar258._0_4_;
          auVar288._0_4_ = fVar181 * auVar121._0_4_;
          fVar182 = auVar258._4_4_;
          auVar288._4_4_ = fVar182 * auVar121._4_4_;
          fVar183 = auVar258._8_4_;
          auVar288._8_4_ = fVar183 * auVar121._8_4_;
          fVar280 = auVar258._12_4_;
          auVar288._12_4_ = fVar280 * auVar121._12_4_;
          auVar113._0_4_ = fVar181 * auVar160._0_4_;
          auVar113._4_4_ = fVar182 * auVar160._4_4_;
          auVar113._8_4_ = fVar183 * auVar160._8_4_;
          auVar113._12_4_ = fVar280 * auVar160._12_4_;
          auVar347._0_4_ = fVar141 * auVar93._0_4_;
          auVar347._4_4_ = fVar119 * auVar93._4_4_;
          auVar347._8_4_ = fVar138 * auVar93._8_4_;
          auVar347._12_4_ = fVar139 * auVar93._12_4_;
          auVar304._0_4_ = fVar141 * auVar97._0_4_;
          auVar304._4_4_ = fVar119 * auVar97._4_4_;
          auVar304._8_4_ = fVar138 * auVar97._8_4_;
          auVar304._12_4_ = fVar139 * auVar97._12_4_;
          auVar244._0_4_ = fVar181 * auVar93._0_4_;
          auVar244._4_4_ = fVar182 * auVar93._4_4_;
          auVar244._8_4_ = fVar183 * auVar93._8_4_;
          auVar244._12_4_ = fVar280 * auVar93._12_4_;
          auVar314._0_4_ = fVar181 * auVar97._0_4_;
          auVar314._4_4_ = fVar182 * auVar97._4_4_;
          auVar314._8_4_ = fVar183 * auVar97._8_4_;
          auVar314._12_4_ = fVar280 * auVar97._12_4_;
          auVar93 = vminps_avx(auVar347,auVar304);
          auVar97 = vminps_avx(auVar244,auVar314);
          auVar93 = vminps_avx(auVar93,auVar97);
          auVar97 = vmaxps_avx(auVar304,auVar347);
          auVar258 = vminps_avx(auVar263,auVar330);
          auVar120 = vminps_avx(auVar288,auVar113);
          auVar258 = vminps_avx(auVar258,auVar120);
          auVar93 = vhaddps_avx(auVar93,auVar258);
          auVar258 = vmaxps_avx(auVar314,auVar244);
          auVar97 = vmaxps_avx(auVar258,auVar97);
          auVar258 = vmaxps_avx(auVar330,auVar263);
          auVar120 = vmaxps_avx(auVar113,auVar288);
          auVar258 = vmaxps_avx(auVar120,auVar258);
          auVar97 = vhaddps_avx(auVar97,auVar258);
          auVar258 = vshufps_avx(auVar92,auVar92,0x54);
          auVar258 = vsubps_avx(auVar258,_local_658);
          auVar93 = vshufps_avx(auVar93,auVar93,0xe8);
          auVar97 = vshufps_avx(auVar97,auVar97,0xe8);
          auVar264._0_4_ = auVar258._0_4_ + auVar93._0_4_;
          auVar264._4_4_ = auVar258._4_4_ + auVar93._4_4_;
          auVar264._8_4_ = auVar258._8_4_ + auVar93._8_4_;
          auVar264._12_4_ = auVar258._12_4_ + auVar93._12_4_;
          auVar245._0_4_ = auVar258._0_4_ + auVar97._0_4_;
          auVar245._4_4_ = auVar258._4_4_ + auVar97._4_4_;
          auVar245._8_4_ = auVar258._8_4_ + auVar97._8_4_;
          auVar245._12_4_ = auVar258._12_4_ + auVar97._12_4_;
          auVar93 = vmaxps_avx(auVar98,auVar264);
          auVar97 = vminps_avx(auVar245,auVar104);
          auVar93 = vcmpps_avx(auVar97,auVar93,1);
          auVar93 = vshufps_avx(auVar93,auVar93,0x50);
          local_668 = vinsertps_avx(auVar203,ZEXT416((uint)auVar204._0_4_),0x10);
          if ((auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar93[0xf] < '\0') goto LAB_017910f7;
          bVar73 = 0;
          if ((auVar223._0_4_ < auVar264._0_4_) && (bVar73 = 0, auVar245._0_4_ < auVar104._0_4_)) {
            auVar97 = vmovshdup_avx(auVar264);
            auVar93 = vcmpps_avx(auVar245,auVar104,1);
            bVar73 = auVar93[4] & auVar203._0_4_ < auVar97._0_4_;
          }
          if (((3 < (uint)uVar70 || fVar184 < 0.001) | bVar73) == 1) {
            lVar72 = 200;
            do {
              fVar138 = auVar258._0_4_;
              fVar119 = 1.0 - fVar138;
              fVar184 = fVar119 * fVar119 * fVar119;
              fVar141 = fVar138 * 3.0 * fVar119 * fVar119;
              fVar119 = fVar119 * fVar138 * fVar138 * 3.0;
              auVar196._4_4_ = fVar184;
              auVar196._0_4_ = fVar184;
              auVar196._8_4_ = fVar184;
              auVar196._12_4_ = fVar184;
              auVar131._4_4_ = fVar141;
              auVar131._0_4_ = fVar141;
              auVar131._8_4_ = fVar141;
              auVar131._12_4_ = fVar141;
              auVar114._4_4_ = fVar119;
              auVar114._0_4_ = fVar119;
              auVar114._8_4_ = fVar119;
              auVar114._12_4_ = fVar119;
              fVar138 = fVar138 * fVar138 * fVar138;
              auVar219._0_4_ = (float)local_3c8._0_4_ * fVar138;
              auVar219._4_4_ = (float)local_3c8._4_4_ * fVar138;
              auVar219._8_4_ = fStack_3c0 * fVar138;
              auVar219._12_4_ = fStack_3bc * fVar138;
              auVar93 = vfmadd231ps_fma(auVar219,auVar164,auVar114);
              auVar93 = vfmadd231ps_fma(auVar93,auVar18,auVar131);
              auVar93 = vfmadd231ps_fma(auVar93,auVar17,auVar196);
              auVar115._8_8_ = auVar93._0_8_;
              auVar115._0_8_ = auVar93._0_8_;
              auVar93 = vshufpd_avx(auVar93,auVar93,3);
              auVar97 = vshufps_avx(auVar258,auVar258,0x55);
              auVar93 = vsubps_avx(auVar93,auVar115);
              auVar97 = vfmadd213ps_fma(auVar93,auVar97,auVar115);
              fVar184 = auVar97._0_4_;
              auVar93 = vshufps_avx(auVar97,auVar97,0x55);
              auVar116._0_4_ = fVar142 * fVar184 + fVar200 * auVar93._0_4_;
              auVar116._4_4_ = auVar83._4_4_ * fVar184 + auVar81._4_4_ * auVar93._4_4_;
              auVar116._8_4_ = auVar83._8_4_ * fVar184 + auVar81._8_4_ * auVar93._8_4_;
              auVar116._12_4_ = auVar83._12_4_ * fVar184 + auVar81._12_4_ * auVar93._12_4_;
              auVar258 = vsubps_avx(auVar258,auVar116);
              auVar93 = vandps_avx(auVar336,auVar97);
              auVar97 = vshufps_avx(auVar93,auVar93,0xf5);
              auVar93 = vmaxss_avx(auVar97,auVar93);
              if (auVar93._0_4_ < (float)local_278._0_4_) {
                local_1f8 = auVar258._0_4_;
                if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
                  auVar93 = vmovshdup_avx(auVar258);
                  fVar184 = auVar93._0_4_;
                  if ((0.0 <= fVar184) && (fVar184 <= 1.0)) {
                    auVar93 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar121 = vinsertps_avx(auVar93,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar93 = vdpps_avx(auVar121,local_3d8,0x7f);
                    auVar83 = vdpps_avx(auVar121,local_3e8,0x7f);
                    auVar81 = vdpps_avx(auVar121,local_288,0x7f);
                    auVar97 = vdpps_avx(auVar121,local_298,0x7f);
                    auVar98 = vdpps_avx(auVar121,local_2a8,0x7f);
                    auVar104 = vdpps_avx(auVar121,local_2b8,0x7f);
                    auVar120 = vdpps_avx(auVar121,local_2c8,0x7f);
                    auVar121 = vdpps_avx(auVar121,local_2d8,0x7f);
                    fVar142 = 1.0 - fVar184;
                    auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * auVar98._0_4_)),
                                              ZEXT416((uint)fVar142),auVar93);
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar104._0_4_ * fVar184)),
                                              ZEXT416((uint)fVar142),auVar83);
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar120._0_4_ * fVar184)),
                                              ZEXT416((uint)fVar142),auVar81);
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * auVar121._0_4_)),
                                              ZEXT416((uint)fVar142),auVar97);
                    fVar141 = 1.0 - local_1f8;
                    fVar184 = fVar141 * local_1f8 * local_1f8 * 3.0;
                    fVar138 = local_1f8 * local_1f8 * local_1f8;
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar97._0_4_ * fVar138)),
                                              ZEXT416((uint)fVar184),auVar81);
                    fVar142 = local_1f8 * 3.0 * fVar141 * fVar141;
                    auVar83 = vfmadd231ss_fma(auVar81,ZEXT416((uint)fVar142),auVar83);
                    fVar200 = fVar141 * fVar141 * fVar141;
                    auVar93 = vfmadd231ss_fma(auVar83,ZEXT416((uint)fVar200),auVar93);
                    fVar119 = auVar93._0_4_;
                    if ((fVar79 <= fVar119) &&
                       (fVar139 = *(float *)(ray + k * 4 + 0x80), fVar119 <= fVar139)) {
                      pGVar7 = (context->scene->geometries).items[uVar69].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        bVar78 = false;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar78 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0))
                      {
                        local_1e8 = vshufps_avx(auVar258,auVar258,0x55);
                        auVar265._8_4_ = 0x3f800000;
                        auVar265._0_8_ = &DAT_3f8000003f800000;
                        auVar265._12_4_ = 0x3f800000;
                        auVar93 = vsubps_avx(auVar265,local_1e8);
                        fVar181 = local_1e8._0_4_;
                        auVar277._0_4_ = fVar181 * (float)local_428._0_4_;
                        fVar182 = local_1e8._4_4_;
                        auVar277._4_4_ = fVar182 * (float)local_428._4_4_;
                        fVar183 = local_1e8._8_4_;
                        auVar277._8_4_ = fVar183 * fStack_420;
                        fVar280 = local_1e8._12_4_;
                        auVar277._12_4_ = fVar280 * fStack_41c;
                        local_4e8 = auVar20._0_4_;
                        fStack_4e4 = auVar20._4_4_;
                        fStack_4e0 = auVar20._8_4_;
                        fStack_4dc = auVar20._12_4_;
                        auVar289._0_4_ = fVar181 * local_4e8;
                        auVar289._4_4_ = fVar182 * fStack_4e4;
                        auVar289._8_4_ = fVar183 * fStack_4e0;
                        auVar289._12_4_ = fVar280 * fStack_4dc;
                        auVar305._0_4_ = fVar181 * (float)local_438._0_4_;
                        auVar305._4_4_ = fVar182 * (float)local_438._4_4_;
                        auVar305._8_4_ = fVar183 * fStack_430;
                        auVar305._12_4_ = fVar280 * fStack_42c;
                        local_4f8 = auVar21._0_4_;
                        fStack_4f4 = auVar21._4_4_;
                        fStack_4f0 = auVar21._8_4_;
                        fStack_4ec = auVar21._12_4_;
                        auVar315._0_4_ = fVar181 * local_4f8;
                        auVar315._4_4_ = fVar182 * fStack_4f4;
                        auVar315._8_4_ = fVar183 * fStack_4f0;
                        auVar315._12_4_ = fVar280 * fStack_4ec;
                        auVar83 = vfmadd231ps_fma(auVar277,auVar93,local_3f8);
                        auVar81 = vfmadd231ps_fma(auVar289,auVar93,auVar19);
                        auVar97 = vfmadd231ps_fma(auVar305,auVar93,local_408);
                        auVar98 = vfmadd231ps_fma(auVar315,auVar93,local_418);
                        auVar93 = vsubps_avx(auVar81,auVar83);
                        auVar83 = vsubps_avx(auVar97,auVar81);
                        auVar81 = vsubps_avx(auVar98,auVar97);
                        auVar306._0_4_ = auVar83._0_4_ * local_1f8;
                        auVar306._4_4_ = auVar83._4_4_ * local_1f8;
                        auVar306._8_4_ = auVar83._8_4_ * local_1f8;
                        auVar306._12_4_ = auVar83._12_4_ * local_1f8;
                        auVar220._4_4_ = fVar141;
                        auVar220._0_4_ = fVar141;
                        auVar220._8_4_ = fVar141;
                        auVar220._12_4_ = fVar141;
                        auVar93 = vfmadd231ps_fma(auVar306,auVar220,auVar93);
                        auVar266._0_4_ = auVar81._0_4_ * local_1f8;
                        auVar266._4_4_ = auVar81._4_4_ * local_1f8;
                        auVar266._8_4_ = auVar81._8_4_ * local_1f8;
                        auVar266._12_4_ = auVar81._12_4_ * local_1f8;
                        auVar83 = vfmadd231ps_fma(auVar266,auVar220,auVar83);
                        auVar267._0_4_ = auVar83._0_4_ * local_1f8;
                        auVar267._4_4_ = auVar83._4_4_ * local_1f8;
                        auVar267._8_4_ = auVar83._8_4_ * local_1f8;
                        auVar267._12_4_ = auVar83._12_4_ * local_1f8;
                        auVar83 = vfmadd231ps_fma(auVar267,auVar220,auVar93);
                        auVar197._0_4_ = fVar138 * (float)local_358._0_4_;
                        auVar197._4_4_ = fVar138 * (float)local_358._4_4_;
                        auVar197._8_4_ = fVar138 * fStack_350;
                        auVar197._12_4_ = fVar138 * fStack_34c;
                        auVar132._4_4_ = fVar184;
                        auVar132._0_4_ = fVar184;
                        auVar132._8_4_ = fVar184;
                        auVar132._12_4_ = fVar184;
                        auVar93 = vfmadd132ps_fma(auVar132,auVar197,local_348);
                        auVar177._4_4_ = fVar142;
                        auVar177._0_4_ = fVar142;
                        auVar177._8_4_ = fVar142;
                        auVar177._12_4_ = fVar142;
                        auVar93 = vfmadd132ps_fma(auVar177,auVar93,local_338);
                        auVar133._0_4_ = auVar83._0_4_ * 3.0;
                        auVar133._4_4_ = auVar83._4_4_ * 3.0;
                        auVar133._8_4_ = auVar83._8_4_ * 3.0;
                        auVar133._12_4_ = auVar83._12_4_ * 3.0;
                        auVar155._4_4_ = fVar200;
                        auVar155._0_4_ = fVar200;
                        auVar155._8_4_ = fVar200;
                        auVar155._12_4_ = fVar200;
                        auVar83 = vfmadd132ps_fma(auVar155,auVar93,local_328);
                        auVar93 = vshufps_avx(auVar133,auVar133,0xc9);
                        auVar178._0_4_ = auVar83._0_4_ * auVar93._0_4_;
                        auVar178._4_4_ = auVar83._4_4_ * auVar93._4_4_;
                        auVar178._8_4_ = auVar83._8_4_ * auVar93._8_4_;
                        auVar178._12_4_ = auVar83._12_4_ * auVar93._12_4_;
                        auVar93 = vshufps_avx(auVar83,auVar83,0xc9);
                        auVar83 = vfmsub231ps_fma(auVar178,auVar133,auVar93);
                        auVar93 = vshufps_avx(auVar83,auVar83,0x55);
                        local_228[0] = (RTCHitN)auVar93[0];
                        local_228[1] = (RTCHitN)auVar93[1];
                        local_228[2] = (RTCHitN)auVar93[2];
                        local_228[3] = (RTCHitN)auVar93[3];
                        local_228[4] = (RTCHitN)auVar93[4];
                        local_228[5] = (RTCHitN)auVar93[5];
                        local_228[6] = (RTCHitN)auVar93[6];
                        local_228[7] = (RTCHitN)auVar93[7];
                        local_228[8] = (RTCHitN)auVar93[8];
                        local_228[9] = (RTCHitN)auVar93[9];
                        local_228[10] = (RTCHitN)auVar93[10];
                        local_228[0xb] = (RTCHitN)auVar93[0xb];
                        local_228[0xc] = (RTCHitN)auVar93[0xc];
                        local_228[0xd] = (RTCHitN)auVar93[0xd];
                        local_228[0xe] = (RTCHitN)auVar93[0xe];
                        local_228[0xf] = (RTCHitN)auVar93[0xf];
                        local_218 = vshufps_avx(auVar83,auVar83,0xaa);
                        local_208 = auVar83._0_4_;
                        uStack_204 = local_208;
                        uStack_200 = local_208;
                        uStack_1fc = local_208;
                        fStack_1f4 = local_1f8;
                        fStack_1f0 = local_1f8;
                        fStack_1ec = local_1f8;
                        local_1d8 = CONCAT44(uStack_314,local_318);
                        uStack_1d0 = CONCAT44(uStack_30c,uStack_310);
                        local_1c8._4_4_ = uStack_304;
                        local_1c8._0_4_ = local_308;
                        local_1c8._8_4_ = uStack_300;
                        local_1c8._12_4_ = uStack_2fc;
                        vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
                        uStack_1b4 = context->user->instID[0];
                        local_1b8 = uStack_1b4;
                        uStack_1b0 = uStack_1b4;
                        uStack_1ac = uStack_1b4;
                        uStack_1a8 = context->user->instPrimID[0];
                        uStack_1a4 = uStack_1a8;
                        uStack_1a0 = uStack_1a8;
                        uStack_19c = uStack_1a8;
                        *(float *)(ray + k * 4 + 0x80) = fVar119;
                        local_458 = *local_448;
                        uStack_450 = local_448[1];
                        local_3a8.valid = (int *)&local_458;
                        local_3a8.geometryUserPtr = pGVar7->userPtr;
                        local_3a8.context = context->user;
                        local_3a8.ray = (RTCRayN *)ray;
                        local_3a8.hit = local_228;
                        local_3a8.N = 4;
                        local_378._0_4_ = (int)uVar76;
                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar7->occlusionFilterN)(&local_3a8);
                          uVar76 = (ulong)(uint)local_378._0_4_;
                        }
                        auVar58._8_8_ = uStack_450;
                        auVar58._0_8_ = local_458;
                        if (auVar58 == (undefined1  [16])0x0) {
                          auVar93 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar93 = auVar93 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_3a8);
                            uVar76 = (ulong)(uint)local_378._0_4_;
                          }
                          auVar59._8_8_ = uStack_450;
                          auVar59._0_8_ = local_458;
                          auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,auVar59);
                          auVar93 = auVar83 ^ _DAT_01febe20;
                          auVar134._8_4_ = 0xff800000;
                          auVar134._0_8_ = 0xff800000ff800000;
                          auVar134._12_4_ = 0xff800000;
                          auVar83 = vblendvps_avx(auVar134,*(undefined1 (*) [16])
                                                            (local_3a8.ray + 0x80),auVar83);
                          *(undefined1 (*) [16])(local_3a8.ray + 0x80) = auVar83;
                        }
                        auVar93 = vpslld_avx(auVar93,0x1f);
                        iVar68 = vmovmskps_avx(auVar93);
                        if (iVar68 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar139;
                        }
                        bVar78 = (char)iVar68 != '\0';
                      }
                      uVar76 = CONCAT71((int7)(uVar76 >> 8),(byte)uVar76 | bVar78);
                    }
                  }
                }
                break;
              }
              lVar72 = lVar72 + -1;
            } while (lVar72 != 0);
          }
          else {
            bVar53 = false;
          }
        }
      }
    } while (bVar53);
    local_2e8 = vinsertps_avx(auVar31,ZEXT416((uint)fVar199),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }